

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_avx512::forward_int8_x86
          (Convolution_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Layer *pLVar6;
  undefined1 auVar7 [32];
  Option *opt_00;
  Option OVar8;
  Option OVar9;
  int iVar10;
  uint uVar11;
  ulong *puVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  undefined1 (*pauVar19) [64];
  long lVar20;
  long lVar21;
  undefined1 (*pauVar22) [32];
  undefined1 (*pauVar23) [16];
  ulong uVar24;
  int iVar25;
  void *pvVar26;
  long lVar27;
  int *piVar28;
  int iVar29;
  void *pvVar30;
  undefined1 (*pauVar31) [32];
  long lVar32;
  undefined1 (*pauVar33) [64];
  long lVar34;
  long lVar35;
  int m_12;
  int iVar36;
  int iVar37;
  int iVar38;
  undefined4 uVar41;
  FILE *pFVar39;
  int *piVar40;
  int iVar42;
  long lVar43;
  ulong uVar44;
  int m_10;
  int iVar45;
  int iVar46;
  int iVar47;
  undefined1 (*pauVar48) [16];
  undefined8 uVar49;
  int iVar50;
  int iVar51;
  ulong *puVar52;
  int iVar53;
  long lVar54;
  int m_2;
  void *pvVar55;
  ulong uVar56;
  long lVar57;
  long lVar58;
  int iVar59;
  Convolution_x86_avx512 *pCVar60;
  int m_13;
  int iVar61;
  int iVar62;
  uint uVar63;
  int iVar64;
  ulong uVar65;
  bool bVar66;
  int m_3;
  uint uVar67;
  ulong uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar104 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar105 [32];
  int TILE_N;
  int TILE_M;
  int TILE_K;
  Mat m;
  Mat m_1;
  Option opt_q;
  int in_stack_fffffffffffff600;
  uint local_990;
  int local_98c;
  void *local_988;
  ulong local_980;
  Allocator *local_978;
  Option *local_970;
  ulong local_968;
  ulong local_960;
  long local_958;
  ulong local_950;
  Allocator *local_948;
  Convolution_x86_avx512 *local_940;
  ulong local_938;
  Mat local_930;
  long local_8e8;
  long local_8e0;
  int local_8d4;
  undefined8 local_8d0;
  ulong local_8c8;
  Mat local_8c0;
  ulong local_878;
  long local_870;
  long local_868;
  long local_860;
  int local_858;
  int local_854;
  Mat local_850;
  ulong local_808;
  void *local_800;
  int *local_7f8;
  Mat local_7f0;
  int local_7a4;
  Mat *local_7a0;
  ulong local_798;
  Allocator *local_790;
  ulong local_788;
  int local_77c;
  int local_778;
  int local_774;
  Mat local_770;
  undefined8 local_720;
  Mat local_718;
  Mat local_6d0;
  undefined1 local_680 [20];
  int aiStack_66c [3];
  Allocator *pAStack_660;
  int aiStack_658 [2];
  int iStack_650;
  undefined8 uStack_64c;
  undefined4 uStack_644;
  undefined8 local_640;
  int aiStack_638 [2];
  undefined1 auStack_630 [16];
  int aiStack_620 [8];
  undefined1 local_600 [8];
  int aiStack_5f8 [6];
  undefined1 auStack_5e0 [24];
  int aiStack_5c8 [2];
  undefined1 local_5c0 [64];
  undefined1 local_580 [16];
  undefined1 aauStack_570 [3] [16];
  undefined1 local_540 [48];
  undefined1 aauStack_510 [9] [16];
  undefined1 auStack_480 [32];
  undefined1 local_460 [5] [32];
  undefined1 local_3c0 [384];
  undefined1 local_240 [6] [64];
  undefined1 local_c0 [2] [64];
  
  auVar69 = in_ZMM1._0_16_;
  local_6d0.elempack = bottom_blob->elempack;
  local_6d0.elemsize = bottom_blob->elemsize;
  piVar40 = bottom_blob->refcount;
  local_6d0.data = bottom_blob->data;
  local_6d0.refcount = bottom_blob->refcount;
  local_6d0.allocator = bottom_blob->allocator;
  local_6d0.dims = bottom_blob->dims;
  local_6d0.w = bottom_blob->w;
  local_6d0.h = bottom_blob->h;
  local_6d0.d = bottom_blob->d;
  local_6d0.c = bottom_blob->c;
  local_6d0.cstep = bottom_blob->cstep;
  if (piVar40 != (int *)0x0) {
    LOCK();
    *piVar40 = *piVar40 + 1;
    UNLOCK();
  }
  if (local_6d0.elempack == 0 || ((int)local_6d0.elemsize * 8) / local_6d0.elempack != 8) {
    auVar75 = vmovdqu64_avx512f((undefined1  [64])*opt);
    auVar75 = vmovdqa64_avx512f(auVar75);
    stack0xfffffffffffff990 = auVar75._16_48_;
    local_680._0_8_ = auVar75._0_8_;
    local_680._8_8_ = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_6d0,&(this->super_Convolution).bottom_blob_int8_scales,
                     (Option *)local_680);
    iVar50 = -100;
    if ((local_6d0.data == (void *)0x0) || ((long)local_6d0.c * local_6d0.cstep == 0))
    goto LAB_0018a03f;
  }
  local_770.cstep = 0;
  local_770.data = (void *)0x0;
  local_770.refcount._0_4_ = 0;
  local_770.refcount._4_4_ = 0;
  local_770.elemsize = 0;
  local_770.elempack = 0;
  local_770.allocator = (Allocator *)0x0;
  local_770.dims = 0;
  local_770.w = 0;
  local_770.h = 0;
  local_770.d = 0;
  local_770.c = 0;
  Convolution::make_padding(&this->super_Convolution,&local_6d0,&local_770,opt);
  iVar45 = local_770.c;
  iVar10 = local_770.elempack;
  iVar50 = -100;
  if ((local_770.data != (void *)0x0) && (local_770.cstep * (long)local_770.c != 0)) {
    uVar11 = (this->super_Convolution).num_output;
    iVar36 = (~(((this->super_Convolution).kernel_w + -1) * (this->super_Convolution).dilation_w) +
             local_770.w) / (this->super_Convolution).stride_w + 1;
    iVar62 = (~(((this->super_Convolution).kernel_h + -1) * (this->super_Convolution).dilation_h) +
             local_770.h) / (this->super_Convolution).stride_h + 1;
    local_854 = (this->super_Convolution).int8_scale_term;
    if (opt->use_packing_layout == true) {
      if (local_854 < 0x65) {
        if ((uVar11 & 0xf) == 0) {
          uVar63 = 0x10;
        }
        else if ((uVar11 & 7) == 0) {
          uVar63 = 8;
        }
        else {
          uVar63 = (uint)((uVar11 & 3) == 0) * 3 + 1;
        }
      }
      else {
        uVar63 = 1;
        if ((uVar11 & 7) == 0) {
          uVar63 = 8;
        }
      }
    }
    else {
      uVar63 = 1;
    }
    uVar67 = uVar63 * 4;
    if (100 < local_854) {
      uVar67 = uVar63;
    }
    local_940 = this;
    local_7a0 = top_blob;
    Mat::create(top_blob,iVar36,iVar62,(int)uVar11 / (int)uVar63,(ulong)uVar67,uVar63,
                opt->blob_allocator);
    pCVar60 = local_940;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if (opt->use_packing_layout == true) {
        uVar11 = (local_940->super_Convolution).num_output;
        if (local_854 < 0x65) {
          if ((uVar11 & 0xf) == 0) {
            iVar50 = 0x10;
          }
          else if ((uVar11 & 7) == 0) {
            iVar50 = 8;
          }
          else {
            iVar50 = (uint)((uVar11 & 3) == 0) * 3 + 1;
          }
        }
        else {
          iVar50 = 1;
          if ((uVar11 & 7) == 0) {
            iVar50 = 8;
          }
        }
      }
      else {
        iVar50 = 1;
      }
      if ((opt->use_winograd23_convolution == false) && (opt->use_winograd43_convolution != true)) {
        bVar66 = false;
      }
      else {
        bVar66 = true;
        if (iVar10 * iVar45 < 9) {
          bVar66 = 8 < (local_940->super_Convolution).num_output;
        }
      }
      if ((opt->use_packing_layout != false) &&
         ((auVar85._0_4_ = (local_940->super_Convolution).kernel_w,
          auVar85._4_4_ = (local_940->super_Convolution).kernel_h,
          auVar85._8_4_ = (local_940->super_Convolution).dilation_w,
          auVar85._12_4_ = (local_940->super_Convolution).dilation_h,
          ((local_940->super_Convolution).stride_w == 1 & opt->use_winograd_convolution &
           (local_940->super_Convolution).stride_h == 1 & auVar85 == _DAT_005391c0 & bVar66) != 0 ||
          (opt->use_sgemm_convolution == false)))) {
        iVar50 = (uint)(((local_940->super_Convolution).num_output & 3) == 0) * 3 + 1;
      }
      local_930.cstep = 0;
      local_930.data = (void *)0x0;
      local_930.refcount._0_4_ = 0;
      local_930.refcount._4_4_ = 0;
      local_930.elemsize = 0;
      local_930.elempack = 0;
      local_930.allocator = (Allocator *)0x0;
      local_930.dims = 0;
      local_930.w = 0;
      local_930.h = 0;
      local_930.d = 0;
      local_930.c = 0;
      uVar41 = 0;
      Mat::create(&local_930,iVar36,iVar62,(local_940->super_Convolution).num_output / iVar50,
                  (ulong)(uint)(iVar50 * 4),iVar50,opt->workspace_allocator);
      iVar50 = -100;
      if ((local_930.data != (void *)0x0) &&
         (local_970 = opt, (long)local_930.c * local_930.cstep != 0)) {
        iVar50 = pCVar60->nT;
        iVar10 = iVar50;
        if (iVar50 == 0) {
          iVar10 = opt->num_threads;
        }
        if (opt->num_threads != iVar50 && iVar50 != 0) {
          fprintf(_stderr,"opt.num_threads %d changed, convolution gemm will use load-time value %d"
                 );
          pFVar39 = _stderr;
          fputc(10,_stderr);
          uVar41 = (undefined4)((ulong)pFVar39 >> 0x20);
        }
        iVar50 = (pCVar60->super_Convolution).kernel_w;
        iVar45 = (pCVar60->super_Convolution).kernel_h;
        iVar36 = (pCVar60->super_Convolution).dilation_w;
        iVar62 = (pCVar60->super_Convolution).dilation_h;
        iVar29 = (pCVar60->super_Convolution).stride_w;
        iVar46 = (pCVar60->super_Convolution).stride_h;
        if (((iVar46 == 1 && (iVar29 == 1 && iVar62 == 1)) &
            (iVar36 == 1 && iVar45 == 3) & iVar50 == 3 & bVar66 & opt->use_winograd_convolution) ==
            1) {
          if (((opt->use_winograd43_convolution == true) &&
              ((pCVar60->weight_winograd43_data).data != (void *)0x0)) &&
             ((long)(pCVar60->weight_winograd43_data).c * (pCVar60->weight_winograd43_data).cstep !=
              0)) {
            iVar50 = cpu_support_x86_avx512_vnni();
            if (iVar50 == 0) {
              iVar50 = cpu_support_x86_avx_vnni();
              if (iVar50 == 0) {
                auVar94._4_4_ = local_930.h;
                auVar94._0_4_ = local_930.w;
                auVar71._8_4_ = 3;
                auVar71._0_8_ = 0x300000003;
                auVar71._12_4_ = 3;
                auVar94._8_8_ = 0;
                auVar69 = vpaddd_avx512vl(auVar94,auVar71);
                auVar85 = vpsrad_avx(auVar69,0x1f);
                auVar85 = vpsrld_avx(auVar85,0x1e);
                auVar69 = vpaddd_avx(auVar69,auVar85);
                auVar85 = vpsrad_avx(auVar69,2);
                auVar69 = vpshufd_avx(auVar85,0x55);
                auVar69 = vpmulld_avx(auVar69,auVar85);
                uVar63 = local_930.elempack * local_930.c;
                uVar44 = (ulong)uVar63;
                local_980 = CONCAT44(uVar41,auVar69._0_4_);
                uVar67 = local_770.elempack * local_770.c;
                uVar68 = (ulong)uVar67;
                get_optimal_tile_mnk_int8
                          (uVar63,auVar69._0_4_,uVar67,&local_98c,(int *)&local_990,&local_8d4,
                           iVar10);
                iVar50 = local_8d4;
                uVar11 = local_990;
                local_858 = (int)(uVar63 + local_98c + -1) / local_98c;
                iVar45 = (int)((int)local_980 + local_990 + -1) / (int)local_990;
                iVar62 = (int)(uVar67 + local_8d4 + -1) / local_8d4;
                local_7f0.cstep = 0;
                iVar36 = local_8d4 * local_990;
                local_7f0.data = (void *)0x0;
                local_7f0.refcount._0_4_ = 0;
                local_7f0.refcount._4_4_ = 0;
                local_7f0.elemsize = 0;
                local_7f0.elempack = 0;
                local_7f0.allocator = (Allocator *)0x0;
                local_7f0.dims = 0;
                local_7f0.w = 0;
                local_7f0.h = 0;
                local_7f0.d = 0;
                local_7f0.c = 0;
                Mat::create(&local_7f0,iVar36,0x24,iVar62,iVar45,4,local_970->workspace_allocator);
                uVar49 = 0xffffffffffffff9c;
                local_8c8 = uVar44;
                local_788 = uVar68;
                if ((local_7f0.data != (void *)0x0) && ((long)local_7f0.c * local_7f0.cstep != 0)) {
                  iVar45 = iVar45 * iVar62;
                  iVar36 = iVar36 * 0x24;
                  uVar41 = uStack_644;
                  if ((iVar10 < 2) || (iVar10 <= iVar45)) {
                    local_640 = 0;
                    _local_680 = ZEXT1228((undefined1  [12])0x0);
                    _local_680 = ZEXT3260(_local_680);
                    _local_680 = (Option)CONCAT460(uVar41,_local_680);
                    Mat::create((Mat *)local_680,iVar36,1,iVar10,4,local_970->workspace_allocator);
                    if (((void *)local_680._0_8_ != (void *)0x0) &&
                       ((long)(int)uStack_64c._4_4_ * local_640 != 0)) {
                      iVar36 = 0;
                      if (iVar45 < 1) {
                        iVar45 = 0;
                      }
                      for (; iVar45 != iVar36; iVar36 = iVar36 + 1) {
                        iVar29 = (iVar36 / iVar62) * uVar11;
                        iVar46 = (iVar36 % iVar62) * iVar50;
                        uVar63 = (int)local_980 - iVar29;
                        if ((int)uVar11 < (int)uVar63) {
                          uVar63 = uVar11;
                        }
                        iVar59 = (int)local_788 - iVar46;
                        if (iVar50 < iVar59) {
                          iVar59 = iVar50;
                        }
                        iVar51 = get_omp_thread_num();
                        local_8c0.data =
                             (void *)((long)iVar51 * local_640 * (long)stack0xfffffffffffff990 +
                                     local_680._0_8_);
                        local_8c0.refcount._0_4_ = 0;
                        local_8c0.refcount._4_4_ = 0;
                        local_8c0.elemsize = (size_t)stack0xfffffffffffff990;
                        local_8c0.elempack = aiStack_66c[1];
                        local_8c0.allocator = pAStack_660;
                        local_8c0.w = aiStack_658[1];
                        local_8c0.h = iStack_650;
                        local_8c0.d = 1;
                        local_8c0.c = (int)uStack_64c;
                        local_8c0.dims = aiStack_658[0] + -1;
                        local_8c0.cstep =
                             ((long)stack0xfffffffffffff990 *
                              (long)iStack_650 * (long)aiStack_658[1] + 0xfU & 0xfffffffffffffff0) /
                             (ulong)stack0xfffffffffffff990;
                        if (aiStack_658[0] == 4) {
                          local_8c0.cstep = (long)iStack_650 * (long)aiStack_658[1];
                        }
                        conv3x3s1_winograd43_transform_input_tile_int8
                                  (&local_770,&local_8c0,iVar29,uVar63,iVar46,iVar59,
                                   in_stack_fffffffffffff600);
                        local_850.cstep = (long)local_7f0.h * (long)local_7f0.w;
                        local_850.data =
                             (void *)((long)local_7f0.data +
                                     (uint)(iVar36 % iVar62) * local_7f0.elemsize * local_850.cstep
                                     + (long)(iVar36 / iVar62) * local_7f0.cstep *
                                       local_7f0.elemsize);
                        local_850.refcount = (int *)0x0;
                        local_850.elemsize = local_7f0.elemsize;
                        local_850.elempack = local_7f0.elempack;
                        local_850.allocator = local_7f0.allocator;
                        local_850.dims = 2;
                        local_850.w = local_7f0.w;
                        local_850.h = local_7f0.h;
                        local_850.d = 1;
                        local_850.c = 1;
                        transpose_pack_B_tile_int8
                                  (&local_8c0,&local_850,0x24,uVar63,iVar59,(int)local_850.cstep);
                      }
                      if ((Allocator *)local_680._8_8_ != (Allocator *)0x0) {
                        LOCK();
                        *(int *)(_func_int ***)local_680._8_8_ =
                             *(int *)(_func_int ***)local_680._8_8_ + -1;
                        UNLOCK();
                        if (*(int *)(_func_int ***)local_680._8_8_ == 0) {
                          if (pAStack_660 == (Allocator *)0x0) goto LAB_0018b66a;
                          (*pAStack_660->_vptr_Allocator[3])();
                        }
                      }
                      goto LAB_0018b672;
                    }
                    pCVar60 = local_940;
                    if ((Allocator *)local_680._8_8_ != (Allocator *)0x0) {
                      LOCK();
                      *(int *)(_func_int ***)local_680._8_8_ =
                           *(int *)(_func_int ***)local_680._8_8_ + -1;
                      UNLOCK();
                      if (*(int *)(_func_int ***)local_680._8_8_ == 0) {
                        if (pAStack_660 == (Allocator *)0x0) goto LAB_0018b650;
                        (*pAStack_660->_vptr_Allocator[3])();
                        pCVar60 = local_940;
                      }
                    }
                  }
                  else {
                    local_640 = 0;
                    _local_680 = ZEXT1228((undefined1  [12])0x0);
                    _local_680 = ZEXT3260(_local_680);
                    _local_680 = (Option)CONCAT460(uVar41,_local_680);
                    Mat::create((Mat *)local_680,iVar36,4,local_970->workspace_allocator);
                    if (((void *)local_680._0_8_ == (void *)0x0) ||
                       ((long)(int)uStack_64c._4_4_ * local_640 == 0)) {
                      pCVar60 = local_940;
                      if ((Allocator *)local_680._8_8_ != (Allocator *)0x0) {
                        LOCK();
                        *(int *)(_func_int ***)local_680._8_8_ =
                             *(int *)(_func_int ***)local_680._8_8_ + -1;
                        UNLOCK();
                        if (*(int *)(_func_int ***)local_680._8_8_ == 0) {
                          if (pAStack_660 == (Allocator *)0x0) {
LAB_0018b650:
                            free((void *)local_680._0_8_);
                            pCVar60 = local_940;
                          }
                          else {
                            (*pAStack_660->_vptr_Allocator[3])();
                            pCVar60 = local_940;
                          }
                        }
                      }
                    }
                    else {
                      iVar36 = 0;
                      if (iVar45 < 1) {
                        iVar45 = 0;
                      }
                      for (; iVar45 != iVar36; iVar36 = iVar36 + 1) {
                        iVar29 = (iVar36 / iVar62) * uVar11;
                        iVar46 = (iVar36 % iVar62) * iVar50;
                        uVar63 = (int)local_980 - iVar29;
                        if ((int)uVar11 < (int)uVar63) {
                          uVar63 = uVar11;
                        }
                        iVar59 = (int)local_788 - iVar46;
                        if (iVar50 < iVar59) {
                          iVar59 = iVar50;
                        }
                        conv3x3s1_winograd43_transform_input_tile_int8
                                  (&local_770,(Mat *)local_680,iVar29,uVar63,iVar46,iVar59,
                                   in_stack_fffffffffffff600);
                        local_8c0.cstep = (long)local_7f0.h * (long)local_7f0.w;
                        local_8c0.data =
                             (void *)((long)local_7f0.data +
                                     (uint)(iVar36 % iVar62) * local_7f0.elemsize * local_8c0.cstep
                                     + (long)(iVar36 / iVar62) * local_7f0.cstep *
                                       local_7f0.elemsize);
                        local_8c0.refcount._0_4_ = 0;
                        local_8c0.refcount._4_4_ = 0;
                        local_8c0.elemsize = local_7f0.elemsize;
                        local_8c0.elempack = local_7f0.elempack;
                        local_8c0.allocator = local_7f0.allocator;
                        local_8c0.dims = 2;
                        local_8c0.w = local_7f0.w;
                        local_8c0.h = local_7f0.h;
                        local_8c0.d = 1;
                        local_8c0.c = 1;
                        transpose_pack_B_tile_int8
                                  ((Mat *)local_680,&local_8c0,0x24,uVar63,iVar59,
                                   (int)local_8c0.cstep);
                      }
                      if ((Allocator *)local_680._8_8_ != (Allocator *)0x0) {
                        LOCK();
                        *(int *)(_func_int ***)local_680._8_8_ =
                             *(int *)(_func_int ***)local_680._8_8_ + -1;
                        UNLOCK();
                        if (*(int *)(_func_int ***)local_680._8_8_ == 0) {
                          if (pAStack_660 == (Allocator *)0x0) {
LAB_0018b66a:
                            free((void *)local_680._0_8_);
                          }
                          else {
                            (*pAStack_660->_vptr_Allocator[3])();
                          }
                        }
                      }
LAB_0018b672:
                      local_8c0.cstep = 0;
                      local_8c0.data = (void *)0x0;
                      local_8c0.refcount._0_4_ = 0;
                      local_8c0.refcount._4_4_ = 0;
                      local_8c0.elemsize = 0;
                      local_8c0.elempack = 0;
                      local_8c0.allocator = (Allocator *)0x0;
                      local_8c0.dims = 0;
                      local_8c0.w = 0;
                      local_8c0.h = 0;
                      local_8c0.d = 0;
                      local_8c0.c = 0;
                      Mat::create(&local_8c0,local_990 * local_98c * 0x24,1,iVar10,4,
                                  local_970->workspace_allocator);
                      local_720 = 0xffffffffffffff9c;
                      if ((local_8c0.data != (void *)0x0) &&
                         ((long)local_8c0.c * local_8c0.cstep != 0)) {
                        local_720 = 0;
                        if (local_858 < 1) {
                          local_858 = 0;
                        }
                        local_7a4 = 0;
                        uVar44 = local_980;
                        uVar68 = local_8c8;
                        while (iVar50 = local_98c, local_7a4 != local_858) {
                          iVar10 = get_omp_thread_num();
                          local_850.data =
                               (void *)((long)iVar10 * local_8c0.cstep * local_8c0.elemsize +
                                       (long)local_8c0.data);
                          local_850.refcount = (int *)0x0;
                          local_850.elemsize = local_8c0.elemsize;
                          local_850.elempack = local_8c0.elempack;
                          local_850.allocator = local_8c0.allocator;
                          local_850.w = local_8c0.w;
                          local_850.h = local_8c0.h;
                          local_850.c = local_8c0.d;
                          local_850.d = 1;
                          local_850.dims = local_8c0.dims + -1;
                          auVar75 = vbroadcastss_avx512f(ZEXT416(0x3ae38e39));
                          local_850.cstep =
                               (local_8c0.elemsize * (long)local_8c0.h * (long)local_8c0.w + 0xf &
                               0xfffffffffffffff0) / local_8c0.elemsize;
                          if (local_8c0.dims == 4) {
                            local_850.cstep = (long)local_8c0.h * (long)local_8c0.w;
                          }
                          uVar11 = iVar50 * local_7a4;
                          local_878 = (ulong)uVar11;
                          local_77c = (int)uVar68 - uVar11;
                          if (iVar50 < local_77c) {
                            local_77c = iVar50;
                          }
                          local_798 = (ulong)(int)uVar11;
                          local_870 = (long)local_77c;
                          for (iVar50 = 0; uVar65 = local_788, iVar36 = local_7a4,
                              iVar45 = local_8d4, iVar10 = local_98c, uVar63 = local_990,
                              uVar11 = (int)uVar44 - iVar50, uVar11 != 0 && iVar50 <= (int)uVar44;
                              iVar50 = iVar50 + local_990) {
                            if ((int)local_990 < (int)uVar11) {
                              uVar11 = local_990;
                            }
                            local_808 = (ulong)uVar11;
                            uVar56 = local_788 & 0xffffffff;
                            iVar36 = 0;
                            while( true ) {
                              OVar8 = _local_680;
                              iVar46 = (int)uVar56;
                              iVar29 = (int)local_808;
                              iVar62 = (int)local_878;
                              if ((int)uVar65 <= iVar36) break;
                              iVar59 = iVar46;
                              if (iVar45 < iVar46) {
                                iVar59 = iVar45;
                              }
                              iVar51 = (local_940->weight_winograd43_data).w;
                              iVar53 = (local_940->weight_winograd43_data).h;
                              unique0x00012000 =
                                   (Allocator *)(local_940->weight_winograd43_data).elemsize;
                              local_640 = (long)iVar53 * (long)iVar51;
                              local_680._8_8_ = 0;
                              local_680._0_8_ =
                                   (long)(local_940->weight_winograd43_data).data +
                                   (long)unique0x00012000 * local_640 * (long)(iVar36 / iVar45) +
                                   (long)(int)((long)((ulong)(uint)(iVar62 >> 0x1f) << 0x20 |
                                                     local_878 & 0xffffffff) / (long)iVar10) *
                                   (local_940->weight_winograd43_data).cstep *
                                   (long)unique0x00012000;
                              stack0xfffffffffffff99c = OVar8._28_36_;
                              aiStack_66c[1] = (local_940->weight_winograd43_data).elempack;
                              pAStack_660 = (local_940->weight_winograd43_data).allocator;
                              local_718.dims = 2;
                              aiStack_658[0] = 2;
                              aiStack_658[1]._0_1_ = (bool)(char)iVar51;
                              aiStack_658[1]._1_1_ = (bool)(char)((uint)iVar51 >> 8);
                              aiStack_658[1]._2_1_ = (bool)(char)((uint)iVar51 >> 0x10);
                              aiStack_658[1]._3_1_ = (bool)(char)((uint)iVar51 >> 0x18);
                              iStack_650 = iVar53;
                              uStack_644 = OVar8._60_4_;
                              uStack_64c._0_1_ = true;
                              uStack_64c._1_1_ = false;
                              uStack_64c._2_1_ = false;
                              uStack_64c._3_1_ = false;
                              uStack_64c._4_1_ = true;
                              uStack_64c._5_1_ = false;
                              uStack_64c._6_1_ = false;
                              uStack_64c._7_1_ = false;
                              local_718.cstep = (long)local_7f0.h * (long)local_7f0.w;
                              local_718.data =
                                   (void *)((long)local_7f0.data +
                                           local_718.cstep * local_7f0.elemsize *
                                           (long)(iVar36 / iVar45) +
                                           (long)(iVar50 / (int)uVar63) * local_7f0.cstep *
                                           local_7f0.elemsize);
                              local_718.refcount = (int *)0x0;
                              local_718.elemsize = local_7f0.elemsize;
                              local_718.elempack = local_7f0.elempack;
                              local_718.allocator = local_7f0.allocator;
                              local_718.w = local_7f0.w;
                              local_718.h = local_7f0.h;
                              local_718.d = 1;
                              local_718.c = 1;
                              gemm_transB_packed_tile_int8
                                        ((Mat *)local_680,&local_718,&local_850,0x24,local_77c,
                                         iVar29,iVar36,iVar59,(int)uVar65 <= iVar36 + iVar45);
                              auVar75 = vbroadcastss_avx512f(ZEXT416(0x3ae38e39));
                              uVar56 = (ulong)(uint)-(iVar45 - iVar46);
                              uVar44 = local_980;
                              uVar68 = local_8c8;
                              iVar36 = iVar36 + iVar45;
                            }
                            iVar45 = (int)local_930.cstep * local_930.elempack;
                            iVar10 = (local_930.w + 3) / 4;
                            local_8e8 = CONCAT44(local_8e8._4_4_,iVar10);
                            auVar76 = vpbroadcastd_avx512f();
                            auVar76 = vpmulld_avx512f(auVar76,_DAT_005399c0);
                            local_800 = (void *)CONCAT44(local_800._4_4_,iVar45);
                            lVar27 = (long)iVar45;
                            lVar14 = (long)(iVar45 * 2);
                            lVar15 = (long)(iVar45 * 3);
                            lVar16 = (long)(local_930.elempack * local_930.w);
                            local_774 = iVar29 * 0x24;
                            local_968 = 0;
                            local_960 = 0;
                            if (0 < iVar29) {
                              local_960 = local_808 & 0xffffffff;
                            }
                            lVar57 = (long)(iVar29 * 0x30) * 4;
                            lVar54 = (long)(iVar29 << 5) * 4;
                            lVar43 = (long)(iVar29 << 4) * 4;
                            local_7f8 = (int *)CONCAT44(local_7f8._4_4_,iVar29 * 0x240);
                            uVar65 = 0;
                            while (uVar56 = uVar65, (long)(uVar56 | 0xf) < local_870) {
                              lVar17 = (long)(int)local_968;
                              lVar1 = (long)(iVar29 * 0x50) * 4 + lVar17 * 4;
                              lVar20 = (long)(iVar29 << 6) * 4 + lVar17 * 4;
                              lVar58 = lVar57 + lVar17 * 4;
                              lVar21 = lVar54 + lVar17 * 4;
                              lVar35 = lVar43 + lVar17 * 4;
                              lVar34 = 0;
                              for (uVar44 = 0; uVar44 != local_960; uVar44 = uVar44 + 1) {
                                lVar18 = (long)local_850.data + lVar34;
                                for (lVar32 = -0x140; lVar32 != 0; lVar32 = lVar32 + 0x40) {
                                  auVar77 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                               (lVar18 + lVar35));
                                  auVar78 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                               (lVar18 + lVar21));
                                  auVar79 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                               (lVar18 + lVar58));
                                  auVar80 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                               (lVar18 + lVar20));
                                  auVar81 = vpaddd_avx512f(auVar78,auVar77);
                                  auVar82 = vpaddd_avx512f(auVar80,auVar79);
                                  auVar77 = vpsubd_avx512f(auVar77,auVar78);
                                  auVar78 = vpsubd_avx512f(auVar79,auVar80);
                                  auVar79 = vpaddd_avx512f(auVar81,*(undefined1 (*) [64])
                                                                    (lVar18 + lVar17 * 4));
                                  auVar79 = vpaddd_avx512f(auVar79,auVar82);
                                  auVar80 = vpaddd_avx512f(auVar78,auVar78);
                                  auVar80 = vpaddd_avx512f(auVar80,auVar77);
                                  auVar82 = vpslld_avx512f(auVar82,2);
                                  auVar81 = vpaddd_avx512f(auVar82,auVar81);
                                  auVar78 = vpslld_avx512f(auVar78,3);
                                  auVar82 = vpslld_avx512f(*(undefined1 (*) [64])(lVar18 + lVar1),2)
                                  ;
                                  auVar77 = vpaddd_avx512f(auVar77,auVar82);
                                  auVar78 = vpaddd_avx512f(auVar78,auVar77);
                                  auVar77 = vmovdqa64_avx512f(auVar79);
                                  *(undefined1 (*) [64])(local_540 + lVar32) = auVar77;
                                  auVar77 = vmovdqa64_avx512f(auVar80);
                                  *(undefined1 (*) [64])(local_3c0 + lVar32) = auVar77;
                                  auVar77 = vmovdqa64_avx512f(auVar81);
                                  *(undefined1 (*) [64])(local_240[0] + lVar32) = auVar77;
                                  auVar77 = vmovdqa64_avx512f(auVar78);
                                  *(undefined1 (*) [64])(local_c0[0] + lVar32) = auVar77;
                                  lVar18 = lVar18 + (long)(iVar29 * 0x60) * 4;
                                }
                                auVar77 = vmovdqa64_avx512f(*(undefined1 (*) [64])(lVar18 + lVar58))
                                ;
                                auVar78 = vmovdqa64_avx512f(*(undefined1 (*) [64])(lVar18 + lVar20))
                                ;
                                auVar79 = vmovdqa64_avx512f(*(undefined1 (*) [64])(lVar18 + lVar35))
                                ;
                                auVar80 = vmovdqa64_avx512f(*(undefined1 (*) [64])(lVar18 + lVar21))
                                ;
                                auVar81 = vpslld_avx512f(*(undefined1 (*) [64])(lVar18 + lVar1),4);
                                auVar82 = vpaddd_avx512f(auVar78,auVar77);
                                auVar83 = vpaddd_avx512f(auVar80,auVar79);
                                auVar84 = vpaddd_avx512f(auVar83,auVar82);
                                auVar84 = vpaddd_avx512f(auVar84,*(undefined1 (*) [64])
                                                                  (lVar18 + lVar17 * 4));
                                iVar36 = iVar50 + (int)uVar44;
                                iVar45 = iVar36 % iVar10;
                                auVar77 = vpsubd_avx512f(auVar77,auVar78);
                                auVar78 = vpslld_avx512f(auVar77,5);
                                auVar79 = vpsubd_avx512f(auVar79,auVar80);
                                auVar79 = vpslld_avx512f(auVar79,2);
                                auVar78 = vpaddd_avx512f(auVar79,auVar78);
                                auVar78 = vpaddd_avx512f(auVar78,auVar81);
                                auVar80 = vpslld_avx512f(auVar82,4);
                                auVar81 = vpslld_avx512f(auVar83,2);
                                auVar80 = vpaddd_avx512f(auVar81,auVar80);
                                auVar77 = vpslld_avx512f(auVar77,3);
                                auVar77 = vpaddd_avx512f(auVar79,auVar77);
                                auVar79 = vpslld_avx512f(auVar84,2);
                                _local_540 = vmovdqa64_avx512f(auVar79);
                                local_3c0._0_64_ = vmovdqa64_avx512f(auVar77);
                                local_240[0] = vmovdqa64_avx512f(auVar80);
                                local_c0[0] = vmovdqa64_avx512f(auVar78);
                                uVar11 = iVar36 / iVar10 << 2;
                                pauVar19 = (undefined1 (*) [64])
                                           ((long)local_930.data +
                                           (long)(iVar45 * 4 * local_930.elempack) * 4 +
                                           (long)local_930.w * local_930.elemsize *
                                           (long)(int)uVar11 +
                                           (long)((iVar62 + (int)uVar56) / local_930.elempack) *
                                           local_930.cstep * local_930.elemsize);
                                iVar36 = iVar45 * 4 + 1;
                                iVar46 = iVar45 * 4 + 2;
                                iVar45 = iVar45 * 4 + 3;
                                pauVar33 = (undefined1 (*) [64])local_540;
                                for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
                                  if ((int)(uVar11 | (uint)lVar18) < local_930.h) {
                                    auVar77 = vmovdqa64_avx512f(pauVar33[-4]);
                                    auVar78 = vmovdqa64_avx512f(pauVar33[-3]);
                                    auVar79 = vmovdqa64_avx512f(pauVar33[-2]);
                                    auVar80 = vmovdqa64_avx512f(pauVar33[-1]);
                                    auVar81 = vpaddd_avx512f(auVar78,auVar77);
                                    auVar82 = vpaddd_avx512f(auVar80,auVar79);
                                    auVar77 = vpsubd_avx512f(auVar77,auVar78);
                                    auVar78 = vpsubd_avx512f(auVar79,auVar80);
                                    auVar79 = vpaddd_avx512f(auVar81,pauVar33[-5]);
                                    auVar79 = vpaddd_avx512f(auVar79,auVar82);
                                    auVar80 = vpaddd_avx512f(auVar78,auVar78);
                                    auVar80 = vpaddd_avx512f(auVar80,auVar77);
                                    auVar82 = vpslld_avx512f(auVar82,2);
                                    auVar81 = vpaddd_avx512f(auVar82,auVar81);
                                    auVar78 = vpslld_avx512f(auVar78,3);
                                    auVar77 = vpaddd_avx512f(auVar77,*pauVar33);
                                    auVar77 = vpaddd_avx512f(auVar77,auVar78);
                                    auVar78 = vcvtdq2ps_avx512f(auVar79);
                                    auVar78 = vmulps_avx512f(auVar78,auVar75);
                                    auVar78 = vcvttps2dq_avx512f(auVar78);
                                    auVar79 = vcvtdq2ps_avx512f(auVar80);
                                    auVar79 = vmulps_avx512f(auVar79,auVar75);
                                    auVar79 = vcvttps2dq_avx512f(auVar79);
                                    auVar80 = vcvtdq2ps_avx512f(auVar81);
                                    auVar80 = vmulps_avx512f(auVar80,auVar75);
                                    auVar80 = vcvttps2dq_avx512f(auVar80);
                                    auVar77 = vcvtdq2ps_avx512f(auVar77);
                                    auVar77 = vmulps_avx512f(auVar77,auVar75);
                                    auVar77 = vcvttps2dq_avx512f(auVar77);
                                    if (local_930.elempack == 1) {
                                      vpscatterdd_avx512f(ZEXT864(pauVar19) +
                                                          auVar76 * (undefined1  [64])0x4,0xffff,
                                                          auVar78);
                                      if (iVar36 < local_930.w) {
                                        vpscatterdd_avx512f(ZEXT864(pauVar19) + ZEXT864(4) +
                                                            auVar76 * (undefined1  [64])0x4,0xffff,
                                                            auVar79);
                                      }
                                      if (iVar46 < local_930.w) {
                                        vpscatterdd_avx512f(ZEXT864(pauVar19) + ZEXT864(8) +
                                                            auVar76 * (undefined1  [64])0x4,0xffff,
                                                            auVar80);
                                      }
                                      if (iVar45 < local_930.w) {
                                        vpscatterdd_avx512f(ZEXT864(pauVar19) + ZEXT864(0xc) +
                                                            auVar76 * (undefined1  [64])0x4,0xffff,
                                                            auVar77);
                                      }
                                    }
                                    else if (local_930.elempack == 4) {
                                      *(undefined1 (*) [16])*pauVar19 = auVar78._0_16_;
                                      auVar69 = vextracti32x4_avx512f(auVar78,1);
                                      *(undefined1 (*) [16])(*pauVar19 + lVar27 * 4) = auVar69;
                                      auVar69 = vextracti32x4_avx512f(auVar78,2);
                                      *(undefined1 (*) [16])(*pauVar19 + lVar14 * 4) = auVar69;
                                      auVar69 = vextracti32x4_avx512f(auVar78,3);
                                      *(undefined1 (*) [16])(*pauVar19 + lVar15 * 4) = auVar69;
                                      if (iVar36 < local_930.w) {
                                        *(undefined1 (*) [16])(*pauVar19 + 0x10) = auVar79._0_16_;
                                        auVar69 = vextracti32x4_avx512f(auVar79,1);
                                        *(undefined1 (*) [16])(*pauVar19 + lVar27 * 4 + 8) = auVar69
                                        ;
                                        auVar69 = vextracti32x4_avx512f(auVar79,2);
                                        *(undefined1 (*) [16])(*pauVar19 + lVar14 * 4 + 8) = auVar69
                                        ;
                                        auVar69 = vextracti32x4_avx512f(auVar79,3);
                                        *(undefined1 (*) [16])(*pauVar19 + lVar15 * 4 + 8) = auVar69
                                        ;
                                      }
                                      if (iVar46 < local_930.w) {
                                        *(undefined1 (*) [16])(*pauVar19 + 0x20) = auVar80._0_16_;
                                        auVar69 = vextracti32x4_avx512f(auVar80,1);
                                        *(undefined1 (*) [16])(*pauVar19 + lVar27 * 4 + 0x10) =
                                             auVar69;
                                        auVar69 = vextracti32x4_avx512f(auVar80,2);
                                        *(undefined1 (*) [16])(*pauVar19 + lVar14 * 4 + 0x10) =
                                             auVar69;
                                        auVar69 = vextracti32x4_avx512f(auVar80,3);
                                        *(undefined1 (*) [16])(*pauVar19 + lVar15 * 4 + 0x10) =
                                             auVar69;
                                      }
                                      if (iVar45 < local_930.w) {
                                        *(undefined1 (*) [16])(*pauVar19 + 0x30) = auVar77._0_16_;
                                        auVar69 = vextracti32x4_avx512f(auVar77,1);
                                        *(undefined1 (*) [16])(*pauVar19 + lVar27 * 4 + 0x18) =
                                             auVar69;
                                        auVar69 = vextracti32x4_avx512f(auVar77,2);
                                        *(undefined1 (*) [16])(*pauVar19 + lVar14 * 4 + 0x18) =
                                             auVar69;
                                        auVar69 = vextracti32x4_avx512f(auVar77,3);
                                        *(undefined1 (*) [16])(*pauVar19 + lVar15 * 4 + 0x18) =
                                             auVar69;
                                      }
                                    }
                                    else if (local_930.elempack == 8) {
                                      *(undefined1 (*) [32])*pauVar19 = auVar78._0_32_;
                                      auVar72 = vextracti64x4_avx512f(auVar78,1);
                                      *(undefined1 (*) [32])(*pauVar19 + lVar27 * 4) = auVar72;
                                      if (iVar36 < local_930.w) {
                                        *(undefined1 (*) [32])(*pauVar19 + 0x20) = auVar79._0_32_;
                                        auVar72 = vextracti64x4_avx512f(auVar79,1);
                                        *(undefined1 (*) [32])(*pauVar19 + lVar27 * 4 + 0x10) =
                                             auVar72;
                                      }
                                      if (iVar46 < local_930.w) {
                                        *(undefined1 (*) [32])pauVar19[1] = auVar80._0_32_;
                                        auVar72 = vextracti64x4_avx512f(auVar80,1);
                                        *(undefined1 (*) [32])(*pauVar19 + lVar27 * 4 + 0x20) =
                                             auVar72;
                                      }
                                      if (iVar45 < local_930.w) {
                                        *(undefined1 (*) [32])(pauVar19[1] + 0x20) = auVar77._0_32_;
                                        auVar72 = vextracti64x4_avx512f(auVar77,1);
                                        *(undefined1 (*) [32])(*pauVar19 + lVar27 * 4 + 0x30) =
                                             auVar72;
                                      }
                                    }
                                    else if (local_930.elempack == 0x10) {
                                      auVar78 = vmovdqa64_avx512f(auVar78);
                                      *pauVar19 = auVar78;
                                      if (iVar36 < local_930.w) {
                                        auVar78 = vmovdqa64_avx512f(auVar79);
                                        pauVar19[1] = auVar78;
                                      }
                                      if (iVar46 < local_930.w) {
                                        auVar78 = vmovdqa64_avx512f(auVar80);
                                        pauVar19[2] = auVar78;
                                      }
                                      if (iVar45 < local_930.w) {
                                        auVar77 = vmovdqa64_avx512f(auVar77);
                                        pauVar19[3] = auVar77;
                                      }
                                    }
                                    pauVar19 = (undefined1 (*) [64])(*pauVar19 + lVar16 * 4);
                                  }
                                  pauVar33 = pauVar33 + 6;
                                }
                                lVar34 = lVar34 + 0x40;
                              }
                              local_968 = (ulong)(uint)((int)local_968 + iVar29 * 0x240);
                              uVar44 = local_980;
                              uVar68 = local_8c8;
                              local_938 = uVar56;
                              uVar65 = uVar56 + 0x10;
                            }
                            local_868 = (long)(iVar29 * 8);
                            auVar72 = vpbroadcastd_avx512vl();
                            auVar72 = vpmulld_avx2(auVar72,_DAT_0053a780);
                            local_978 = (Allocator *)((long)(iVar29 * 0x28) * 4);
                            local_988 = (void *)((long)(iVar29 * 0x18) * 4);
                            while (uVar65 = uVar56, (long)(uVar65 | 7) < local_870) {
                              lVar20 = (long)(int)local_968;
                              lVar14 = lVar54 + lVar20 * 4;
                              lVar15 = lVar43 + lVar20 * 4;
                              lVar1 = local_868 * 4 + lVar20 * 4;
                              lVar58 = 0;
                              for (uVar44 = 0; uVar44 != local_960; uVar44 = uVar44 + 1) {
                                lVar21 = (long)local_850.data + lVar58;
                                for (lVar35 = -0xa0; lVar35 != 0; lVar35 = lVar35 + 0x20) {
                                  auVar89 = *(undefined1 (*) [32])(lVar21 + lVar1);
                                  auVar90 = *(undefined1 (*) [32])(lVar21 + lVar15);
                                  auVar105 = *(undefined1 (*) [32])
                                              ((long)local_988 + lVar21 + lVar20 * 4);
                                  auVar73 = *(undefined1 (*) [32])(lVar21 + lVar14);
                                  auVar97 = vpaddd_avx2(auVar90,auVar89);
                                  auVar99 = vpaddd_avx2(auVar73,auVar105);
                                  auVar7 = vpsubd_avx2(auVar89,auVar90);
                                  auVar73 = vpsubd_avx2(auVar105,auVar73);
                                  auVar89 = vpaddd_avx2(auVar97,*(undefined1 (*) [32])
                                                                 (lVar21 + lVar20 * 4));
                                  auVar89 = vpaddd_avx2(auVar89,auVar99);
                                  auVar90 = vpaddd_avx2(auVar73,auVar73);
                                  auVar90 = vpaddd_avx2(auVar90,auVar7);
                                  auVar105 = vpslld_avx2(auVar99,2);
                                  auVar105 = vpaddd_avx2(auVar105,auVar97);
                                  auVar97 = vpslld_avx2(auVar73,3);
                                  auVar73 = vpslld_avx512vl(*(undefined1 (*) [32])
                                                             ((long)&local_978->_vptr_Allocator +
                                                             lVar21 + lVar20 * 4),2);
                                  auVar73 = vpaddd_avx2(auVar7,auVar73);
                                  auVar73 = vpaddd_avx2(auVar97,auVar73);
                                  *(undefined1 (*) [32])(auStack_5e0 + lVar35) = auVar89;
                                  *(undefined1 (*) [32])(local_540 + lVar35 + 0x20) = auVar90;
                                  *(undefined1 (*) [32])(local_460[0] + lVar35) = auVar105;
                                  *(undefined1 (*) [32])(local_3c0 + lVar35 + 0x20) = auVar73;
                                  lVar21 = lVar21 + lVar57;
                                }
                                auVar89 = *(undefined1 (*) [32])
                                           ((long)local_988 + lVar21 + lVar20 * 4);
                                auVar90 = *(undefined1 (*) [32])(lVar21 + lVar14);
                                auVar105 = *(undefined1 (*) [32])(lVar21 + lVar1);
                                auVar73 = *(undefined1 (*) [32])(lVar21 + lVar15);
                                auVar74 = vpslld_avx512vl(*(undefined1 (*) [32])
                                                           ((long)&local_978->_vptr_Allocator +
                                                           lVar21 + lVar20 * 4),4);
                                auVar97 = vpaddd_avx2(auVar90,auVar89);
                                auVar99 = vpaddd_avx2(auVar73,auVar105);
                                auVar7 = vpaddd_avx2(auVar99,auVar97);
                                auVar7 = vpaddd_avx2(auVar7,*(undefined1 (*) [32])
                                                             (lVar21 + lVar20 * 4));
                                iVar36 = iVar50 + (int)uVar44;
                                iVar45 = iVar36 % iVar10;
                                auVar90 = vpsubd_avx2(auVar89,auVar90);
                                auVar98 = vpslld_avx2(auVar90,5);
                                auVar89 = vpsubd_avx2(auVar105,auVar73);
                                auVar105 = vpslld_avx2(auVar89,2);
                                auVar89 = vpaddd_avx2(auVar105,auVar98);
                                auVar89 = vpaddd_avx2(auVar89,auVar74);
                                auVar73 = vpslld_avx2(auVar97,4);
                                auVar97 = vpslld_avx2(auVar99,2);
                                local_460[0] = vpaddd_avx2(auVar97,auVar73);
                                auVar90 = vpslld_avx2(auVar90,3);
                                auVar90 = vpaddd_avx2(auVar105,auVar90);
                                _auStack_5e0 = vpslld_avx2(auVar7,2);
                                stack0xfffffffffffffae0 = auVar90;
                                local_3c0._32_32_ = auVar89;
                                uVar11 = iVar36 / iVar10 << 2;
                                pauVar22 = (undefined1 (*) [32])
                                           ((long)local_930.data +
                                           (long)(iVar45 * 4 * local_930.elempack) * 4 +
                                           (long)local_930.w * local_930.elemsize *
                                           (long)(int)uVar11 +
                                           (long)((iVar62 + (int)uVar65) / local_930.elempack) *
                                           local_930.cstep * local_930.elemsize);
                                iVar36 = iVar45 * 4 + 1;
                                iVar46 = iVar45 * 4 + 2;
                                iVar45 = iVar45 * 4 + 3;
                                pauVar31 = (undefined1 (*) [32])auStack_5e0;
                                for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
                                  if ((int)(uVar11 | (uint)lVar21) < local_930.h) {
                                    auVar89 = vpaddd_avx2(pauVar31[-3],pauVar31[-4]);
                                    auVar90 = vpaddd_avx2(pauVar31[-1],pauVar31[-2]);
                                    auVar97 = vpsubd_avx2(pauVar31[-4],pauVar31[-3]);
                                    auVar99 = vpsubd_avx2(pauVar31[-2],pauVar31[-1]);
                                    auVar105 = vpaddd_avx2(auVar89,pauVar31[-5]);
                                    auVar105 = vpaddd_avx2(auVar105,auVar90);
                                    auVar73 = vpaddd_avx2(auVar99,auVar99);
                                    auVar73 = vpaddd_avx2(auVar73,auVar97);
                                    auVar90 = vpslld_avx2(auVar90,2);
                                    auVar90 = vpaddd_avx2(auVar90,auVar89);
                                    auVar99 = vpslld_avx2(auVar99,3);
                                    auVar89 = vpaddd_avx2(auVar97,*pauVar31);
                                    auVar97 = vpaddd_avx2(auVar89,auVar99);
                                    auVar89 = vcvtdq2ps_avx(auVar105);
                                    auVar102._0_4_ = (int)(auVar89._0_4_ * 0.0017361111);
                                    auVar102._4_4_ = (int)(auVar89._4_4_ * 0.0017361111);
                                    auVar102._8_4_ = (int)(auVar89._8_4_ * 0.0017361111);
                                    auVar102._12_4_ = (int)(auVar89._12_4_ * 0.0017361111);
                                    auVar99._16_4_ = (int)(auVar89._16_4_ * 0.0017361111);
                                    auVar99._0_16_ = auVar102;
                                    auVar99._20_4_ = (int)(auVar89._20_4_ * 0.0017361111);
                                    auVar99._24_4_ = (int)(auVar89._24_4_ * 0.0017361111);
                                    auVar99._28_4_ = (int)auVar89._28_4_;
                                    auVar89 = vcvtdq2ps_avx(auVar73);
                                    auVar100._0_4_ = (int)(auVar89._0_4_ * 0.0017361111);
                                    auVar100._4_4_ = (int)(auVar89._4_4_ * 0.0017361111);
                                    auVar100._8_4_ = (int)(auVar89._8_4_ * 0.0017361111);
                                    auVar100._12_4_ = (int)(auVar89._12_4_ * 0.0017361111);
                                    auVar73._16_4_ = (int)(auVar89._16_4_ * 0.0017361111);
                                    auVar73._0_16_ = auVar100;
                                    auVar73._20_4_ = (int)(auVar89._20_4_ * 0.0017361111);
                                    auVar73._24_4_ = (int)(auVar89._24_4_ * 0.0017361111);
                                    auVar73._28_4_ = (int)auVar89._28_4_;
                                    auVar89 = vcvtdq2ps_avx(auVar90);
                                    auVar92._0_4_ = (int)(auVar89._0_4_ * 0.0017361111);
                                    auVar92._4_4_ = (int)(auVar89._4_4_ * 0.0017361111);
                                    auVar92._8_4_ = (int)(auVar89._8_4_ * 0.0017361111);
                                    auVar92._12_4_ = (int)(auVar89._12_4_ * 0.0017361111);
                                    auVar105._16_4_ = (int)(auVar89._16_4_ * 0.0017361111);
                                    auVar105._0_16_ = auVar92;
                                    auVar105._20_4_ = (int)(auVar89._20_4_ * 0.0017361111);
                                    auVar105._24_4_ = (int)(auVar89._24_4_ * 0.0017361111);
                                    auVar105._28_4_ = (int)auVar89._28_4_;
                                    auVar89 = vcvtdq2ps_avx(auVar97);
                                    auVar86._0_4_ = (int)(auVar89._0_4_ * 0.0017361111);
                                    auVar86._4_4_ = (int)(auVar89._4_4_ * 0.0017361111);
                                    auVar86._8_4_ = (int)(auVar89._8_4_ * 0.0017361111);
                                    auVar86._12_4_ = (int)(auVar89._12_4_ * 0.0017361111);
                                    auVar90._16_4_ = (int)(auVar89._16_4_ * 0.0017361111);
                                    auVar90._0_16_ = auVar86;
                                    auVar90._20_4_ = (int)(auVar89._20_4_ * 0.0017361111);
                                    auVar90._24_4_ = (int)(auVar89._24_4_ * 0.0017361111);
                                    auVar90._28_4_ = (int)auVar89._28_4_;
                                    if (local_930.elempack == 1) {
                                      vpscatterdd_avx512vl
                                                (ZEXT832(pauVar22) + auVar72 * (undefined1  [32])0x4
                                                 ,0xffff,auVar99);
                                      if (iVar36 < local_930.w) {
                                        vpscatterdd_avx512vl
                                                  (ZEXT832(pauVar22) + ZEXT832(4) +
                                                   auVar72 * (undefined1  [32])0x4,0xffff,auVar73);
                                      }
                                      if (iVar46 < local_930.w) {
                                        vpscatterdd_avx512vl
                                                  (ZEXT832(pauVar22) + ZEXT832(8) +
                                                   auVar72 * (undefined1  [32])0x4,0xffff,auVar105);
                                      }
                                      if (iVar45 < local_930.w) {
                                        vpscatterdd_avx512vl
                                                  (ZEXT832(pauVar22) + ZEXT832(0xc) +
                                                   auVar72 * (undefined1  [32])0x4,0xffff,auVar90);
                                      }
                                    }
                                    else if (local_930.elempack == 4) {
                                      *(undefined1 (*) [16])*pauVar22 = auVar102;
                                      *(undefined1 (*) [16])(*pauVar22 + lVar27 * 4) =
                                           auVar99._16_16_;
                                      if (iVar36 < local_930.w) {
                                        *(undefined1 (*) [16])(*pauVar22 + 0x10) = auVar100;
                                        *(undefined1 (*) [16])(*pauVar22 + lVar27 * 4 + 0x10) =
                                             auVar73._16_16_;
                                      }
                                      if (iVar46 < local_930.w) {
                                        *(undefined1 (*) [16])pauVar22[1] = auVar92;
                                        *(undefined1 (*) [16])(pauVar22[1] + lVar27 * 4) =
                                             auVar105._16_16_;
                                      }
                                      if (iVar45 < local_930.w) {
                                        *(undefined1 (*) [16])(pauVar22[1] + 0x10) = auVar86;
                                        *(undefined1 (*) [16])(pauVar22[1] + lVar27 * 4 + 0x10) =
                                             auVar90._16_16_;
                                      }
                                    }
                                    else if (local_930.elempack == 8) {
                                      *pauVar22 = auVar99;
                                      if (iVar36 < local_930.w) {
                                        pauVar22[1] = auVar73;
                                      }
                                      if (iVar46 < local_930.w) {
                                        pauVar22[2] = auVar105;
                                      }
                                      if (iVar45 < local_930.w) {
                                        pauVar22[3] = auVar90;
                                      }
                                    }
                                    pauVar22 = (undefined1 (*) [32])(*pauVar22 + lVar16 * 4);
                                  }
                                  pauVar31 = pauVar31 + 6;
                                }
                                lVar58 = lVar58 + 0x20;
                              }
                              local_968 = (ulong)(uint)((int)local_968 + iVar29 * 0x120);
                              uVar44 = local_980;
                              uVar68 = local_8c8;
                              local_938 = uVar65;
                              uVar56 = uVar65 + 8;
                            }
                            local_860 = (long)(iVar29 * 4);
                            auVar69 = vpbroadcastd_avx512vl();
                            auVar69 = vpmulld_avx(auVar69,_DAT_00539450);
                            local_8d0._4_4_ = (undefined4)((ulong)lVar54 >> 0x20);
                            local_8d0 = CONCAT44(local_8d0._4_4_,iVar29 * 0x90);
                            local_950 = local_860 * 4;
                            while (uVar56 = uVar65, (long)(uVar56 | 3) < local_870) {
                              lVar20 = (long)(int)local_968;
                              lVar14 = (long)(iVar29 * 0x14) * 4 + lVar20 * 4;
                              lVar15 = lVar43 + lVar20 * 4;
                              lVar54 = (long)(iVar29 * 0xc) * 4 + lVar20 * 4;
                              lVar57 = local_868 * 4 + lVar20 * 4;
                              lVar1 = local_950 + lVar20 * 4;
                              iVar45 = iVar62 + (int)uVar56;
                              local_978 = (Allocator *)CONCAT44(local_978._4_4_,iVar45);
                              lVar58 = 0;
                              for (uVar44 = 0; uVar44 != local_960; uVar44 = uVar44 + 1) {
                                lVar35 = (long)local_850.data + lVar58;
                                for (lVar21 = -0x50; lVar21 != 0; lVar21 = lVar21 + 0x10) {
                                  auVar85 = *(undefined1 (*) [16])(lVar35 + lVar1);
                                  auVar87 = *(undefined1 (*) [16])(lVar35 + lVar57);
                                  auVar104 = *(undefined1 (*) [16])(lVar35 + lVar54);
                                  auVar70 = *(undefined1 (*) [16])(lVar35 + lVar15);
                                  auVar93 = vpaddd_avx(auVar87,auVar85);
                                  auVar95 = vpaddd_avx(auVar70,auVar104);
                                  auVar91 = vpsubd_avx(auVar85,auVar87);
                                  auVar70 = vpsubd_avx(auVar104,auVar70);
                                  auVar85 = vpaddd_avx(auVar93,*(undefined1 (*) [16])
                                                                (lVar35 + lVar20 * 4));
                                  auVar85 = vpaddd_avx(auVar85,auVar95);
                                  auVar87 = vpaddd_avx(auVar70,auVar70);
                                  auVar87 = vpaddd_avx(auVar87,auVar91);
                                  auVar104 = vpslld_avx(auVar95,2);
                                  auVar104 = vpaddd_avx(auVar104,auVar93);
                                  auVar93 = vpslld_avx(auVar70,3);
                                  auVar70 = vpslld_avx512vl(*(undefined1 (*) [16])(lVar35 + lVar14),
                                                            2);
                                  auVar70 = vpaddd_avx(auVar91,auVar70);
                                  auVar70 = vpaddd_avx(auVar93,auVar70);
                                  *(undefined1 (*) [16])(auStack_630 + lVar21) = auVar85;
                                  *(undefined1 (*) [16])(auStack_5e0 + lVar21 + 0x10) = auVar87;
                                  *(undefined1 (*) [16])(aauStack_570[0] + lVar21) = auVar104;
                                  *(undefined1 (*) [16])(aauStack_510[0] + lVar21) = auVar70;
                                  lVar35 = lVar35 + (long)local_988;
                                }
                                auVar85 = *(undefined1 (*) [16])(lVar35 + lVar54);
                                auVar87 = *(undefined1 (*) [16])(lVar35 + lVar15);
                                auVar104 = *(undefined1 (*) [16])(lVar35 + lVar1);
                                auVar70 = *(undefined1 (*) [16])(lVar35 + lVar57);
                                auVar71 = vpslld_avx512vl(*(undefined1 (*) [16])(lVar35 + lVar14),4)
                                ;
                                auVar93 = vpaddd_avx(auVar87,auVar85);
                                auVar95 = vpaddd_avx(auVar70,auVar104);
                                auVar91 = vpaddd_avx(auVar95,auVar93);
                                auVar91 = vpaddd_avx(auVar91,*(undefined1 (*) [16])
                                                              (lVar35 + lVar20 * 4));
                                iVar46 = iVar50 + (int)uVar44;
                                iVar36 = iVar46 % iVar10;
                                auVar87 = vpsubd_avx(auVar85,auVar87);
                                auVar94 = vpslld_avx(auVar87,5);
                                auVar85 = vpsubd_avx(auVar104,auVar70);
                                auVar104 = vpslld_avx(auVar85,2);
                                auVar85 = vpaddd_avx(auVar104,auVar94);
                                auVar85 = vpaddd_avx(auVar85,auVar71);
                                auVar70 = vpslld_avx(auVar93,4);
                                auVar93 = vpslld_avx(auVar95,2);
                                aauStack_570[0] = vpaddd_avx(auVar93,auVar70);
                                auVar87 = vpslld_avx(auVar87,3);
                                auVar87 = vpaddd_avx(auVar104,auVar87);
                                auStack_630 = vpslld_avx(auVar91,2);
                                stack0xfffffffffffffa30 = auVar87;
                                aauStack_510[0] = auVar85;
                                uVar11 = iVar46 / iVar10 << 2;
                                pauVar23 = (undefined1 (*) [16])
                                           ((long)local_930.data +
                                           (long)(iVar36 * 4 * local_930.elempack) * 4 +
                                           (long)local_930.w * local_930.elemsize *
                                           (long)(int)uVar11 +
                                           (long)(iVar45 / local_930.elempack) * local_930.cstep *
                                           local_930.elemsize);
                                iVar46 = iVar36 * 4 + 1;
                                iVar59 = iVar36 * 4 + 2;
                                iVar36 = iVar36 * 4 + 3;
                                pauVar48 = &auStack_630;
                                for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
                                  if ((int)(uVar11 | (uint)lVar21) < local_930.h) {
                                    auVar85 = vpaddd_avx(pauVar48[-3],pauVar48[-4]);
                                    auVar87 = vpaddd_avx(pauVar48[-1],pauVar48[-2]);
                                    auVar93 = vpsubd_avx(pauVar48[-4],pauVar48[-3]);
                                    auVar95 = vpsubd_avx(pauVar48[-2],pauVar48[-1]);
                                    auVar104 = vpaddd_avx(auVar85,pauVar48[-5]);
                                    auVar104 = vpaddd_avx(auVar104,auVar87);
                                    auVar70 = vpaddd_avx(auVar95,auVar95);
                                    auVar70 = vpaddd_avx(auVar70,auVar93);
                                    auVar87 = vpslld_avx(auVar87,2);
                                    auVar87 = vpaddd_avx(auVar87,auVar85);
                                    auVar95 = vpslld_avx(auVar95,3);
                                    auVar85 = vpaddd_avx(auVar93,*pauVar48);
                                    auVar93 = vpaddd_avx(auVar85,auVar95);
                                    auVar85 = vcvtdq2ps_avx(auVar104);
                                    auVar103._0_4_ = (int)(auVar85._0_4_ * 0.0017361111);
                                    auVar103._4_4_ = (int)(auVar85._4_4_ * 0.0017361111);
                                    auVar103._8_4_ = (int)(auVar85._8_4_ * 0.0017361111);
                                    auVar103._12_4_ = (int)(auVar85._12_4_ * 0.0017361111);
                                    auVar85 = vcvtdq2ps_avx(auVar70);
                                    auVar101._0_4_ = (int)(auVar85._0_4_ * 0.0017361111);
                                    auVar101._4_4_ = (int)(auVar85._4_4_ * 0.0017361111);
                                    auVar101._8_4_ = (int)(auVar85._8_4_ * 0.0017361111);
                                    auVar101._12_4_ = (int)(auVar85._12_4_ * 0.0017361111);
                                    auVar85 = vcvtdq2ps_avx(auVar87);
                                    auVar96._0_4_ = (int)(auVar85._0_4_ * 0.0017361111);
                                    auVar96._4_4_ = (int)(auVar85._4_4_ * 0.0017361111);
                                    auVar96._8_4_ = (int)(auVar85._8_4_ * 0.0017361111);
                                    auVar96._12_4_ = (int)(auVar85._12_4_ * 0.0017361111);
                                    auVar85 = vcvtdq2ps_avx(auVar93);
                                    auVar88._0_4_ = (int)(auVar85._0_4_ * 0.0017361111);
                                    auVar88._4_4_ = (int)(auVar85._4_4_ * 0.0017361111);
                                    auVar88._8_4_ = (int)(auVar85._8_4_ * 0.0017361111);
                                    auVar88._12_4_ = (int)(auVar85._12_4_ * 0.0017361111);
                                    if (local_930.elempack == 1) {
                                      auVar2._8_8_ = 0;
                                      auVar2._0_8_ = pauVar23;
                                      vpscatterdd_avx512vl
                                                (auVar2 + auVar69 * (undefined1  [16])0x4,0xffff,
                                                 auVar103);
                                      if (iVar46 < local_930.w) {
                                        auVar3._8_8_ = 0;
                                        auVar3._0_8_ = pauVar23;
                                        vpscatterdd_avx512vl
                                                  (auVar3 + ZEXT816(4) +
                                                   auVar69 * (undefined1  [16])0x4,0xffff,auVar101);
                                      }
                                      if (iVar59 < local_930.w) {
                                        auVar4._8_8_ = 0;
                                        auVar4._0_8_ = pauVar23;
                                        vpscatterdd_avx512vl
                                                  (auVar4 + ZEXT816(8) +
                                                   auVar69 * (undefined1  [16])0x4,0xffff,auVar96);
                                      }
                                      if (iVar36 < local_930.w) {
                                        auVar5._8_8_ = 0;
                                        auVar5._0_8_ = pauVar23;
                                        vpscatterdd_avx512vl
                                                  (auVar5 + ZEXT816(0xc) +
                                                   auVar69 * (undefined1  [16])0x4,0xffff,auVar88);
                                      }
                                    }
                                    else if (local_930.elempack == 4) {
                                      *pauVar23 = auVar103;
                                      if (iVar46 < local_930.w) {
                                        pauVar23[1] = auVar101;
                                      }
                                      if (iVar59 < local_930.w) {
                                        pauVar23[2] = auVar96;
                                      }
                                      if (iVar36 < local_930.w) {
                                        pauVar23[3] = auVar88;
                                      }
                                    }
                                    pauVar23 = (undefined1 (*) [16])(*pauVar23 + lVar16 * 4);
                                  }
                                  pauVar48 = pauVar48 + 6;
                                }
                                lVar58 = lVar58 + 0x10;
                              }
                              local_968 = (ulong)(uint)((int)local_968 + iVar29 * 0x90);
                              uVar44 = local_980;
                              uVar68 = local_8c8;
                              local_938 = uVar56;
                              uVar65 = uVar56 + 4;
                            }
                            lVar14 = (long)(iVar29 * 2);
                            lVar15 = (long)(iVar29 * 6);
                            lVar16 = (long)(iVar29 * 10);
                            local_778 = iVar29 * 0x48;
                            while (uVar65 = uVar56, (long)(uVar65 | 1) < local_870) {
                              local_790 = (Allocator *)local_930.elemsize;
                              local_800 = (void *)((local_798 + uVar65) * local_930.cstep *
                                                   local_930.elemsize + (long)local_930.data);
                              local_7f8 = (int *)((long)(int)local_968 * 4 + (long)local_850.data);
                              uVar56 = 0;
                              while (uVar24 = uVar56, uVar24 != local_960) {
                                piVar40 = local_7f8;
                                for (lVar43 = -5; OVar8 = _local_680, lVar43 != 0;
                                    lVar43 = lVar43 + 1) {
                                  iVar45 = piVar40[local_860] + piVar40[lVar14];
                                  iVar36 = piVar40[local_860 + 1] + piVar40[lVar14 + 1];
                                  iVar37 = piVar40[lVar14] - piVar40[local_860];
                                  iVar25 = piVar40[lVar14 + 1] - piVar40[local_860 + 1];
                                  iVar62 = piVar40[local_868] + piVar40[lVar15];
                                  iVar47 = piVar40[lVar15] - piVar40[local_868];
                                  iVar46 = piVar40[local_868 + 1] + piVar40[lVar15 + 1];
                                  iVar42 = piVar40[lVar15 + 1] - piVar40[local_868 + 1];
                                  iVar59 = piVar40[lVar16];
                                  iVar51 = piVar40[lVar16 + 1];
                                  iVar53 = piVar40[1];
                                  aiStack_658[lVar43 * 2] = iVar62 + iVar45 + *piVar40;
                                  aiStack_658[lVar43 * 2 + 1] = iVar46 + iVar36 + iVar53;
                                  *(int *)(auStack_630 + lVar43 * 8 + 8) = iVar37 + iVar47 * 2;
                                  aiStack_620[lVar43 * 2 + -1] = iVar25 + iVar42 * 2;
                                  aiStack_5f8[lVar43 * 2] = iVar45 + iVar62 * 4;
                                  aiStack_5f8[lVar43 * 2 + 1] = iVar36 + iVar46 * 4;
                                  aiStack_5c8[lVar43 * 2] = iVar37 + iVar47 * 8 + iVar59 * 4;
                                  *(int *)(local_5c0 + lVar43 * 8 + -4) =
                                       iVar25 + iVar42 * 8 + iVar51 * 4;
                                  piVar40 = piVar40 + iVar29 * 0xc;
                                }
                                iVar45 = piVar40[lVar15];
                                local_978 = (Allocator *)CONCAT44(local_978._4_4_,iVar45);
                                iVar53 = piVar40[lVar15 + 1] - piVar40[local_868 + 1];
                                iVar36 = piVar40[lVar14 + 1];
                                local_988 = (void *)CONCAT44(local_988._4_4_,iVar36);
                                iVar59 = iVar36 - piVar40[local_860 + 1];
                                iVar42 = iVar45 - piVar40[local_868];
                                iVar37 = piVar40[lVar14] - piVar40[local_860];
                                iVar25 = piVar40[lVar15 + 1] + piVar40[local_868 + 1];
                                iVar36 = piVar40[local_860 + 1] + iVar36;
                                iVar45 = piVar40[local_868] + iVar45;
                                iVar51 = piVar40[local_860] + piVar40[lVar14];
                                iVar46 = iVar50 + (int)uVar24;
                                iVar62 = iVar46 % iVar10;
                                aiStack_658[0] = (iVar51 + iVar45 + *piVar40) * 4;
                                _iStack_650 = OVar8._48_16_;
                                aiStack_658[1] = (iVar36 + iVar25 + piVar40[1]) * 4;
                                auStack_630._8_4_ = iVar42 * 8 + iVar37 * 4;
                                auStack_630._12_4_ = iVar53 * 8 + iVar59 * 4;
                                aiStack_5f8[0] = iVar45 * 0x10 + iVar51 * 4;
                                aiStack_5f8[1] = iVar25 * 0x10 + iVar36 * 4;
                                aiStack_5c8[0] = piVar40[lVar16] * 0x10 + iVar42 * 0x20 + iVar37 * 4
                                ;
                                aiStack_5c8[1] =
                                     piVar40[lVar16 + 1] * 0x10 + iVar53 * 0x20 + iVar59 * 4;
                                uVar11 = iVar46 / iVar10 << 2;
                                piVar40 = (int *)((long)local_800 +
                                                 (long)(iVar62 * 4) * 4 +
                                                 (long)local_930.w * local_930.elemsize *
                                                 (long)(int)uVar11);
                                iVar45 = iVar62 * 4 + 3;
                                local_8d0 = CONCAT44(local_8d0._4_4_,iVar45);
                                piVar13 = aiStack_658 + 1;
                                for (lVar43 = 0; lVar43 != 4; lVar43 = lVar43 + 1) {
                                  if ((int)(uVar11 | (uint)lVar43) < local_930.h) {
                                    iVar36 = piVar13[-7] + piVar13[-9];
                                    iVar46 = piVar13[-6] + piVar13[-8];
                                    iVar59 = piVar13[-3] + piVar13[-5];
                                    iVar47 = piVar13[-9] - piVar13[-7];
                                    iVar51 = piVar13[-2] + piVar13[-4];
                                    iVar38 = piVar13[-8] - piVar13[-6];
                                    iVar64 = piVar13[-5] - piVar13[-3];
                                    iVar53 = piVar13[-10];
                                    iVar61 = piVar13[-4] - piVar13[-2];
                                    iVar25 = piVar13[-1];
                                    iVar37 = *piVar13;
                                    iVar42 = (iVar59 + iVar36 + piVar13[-0xb]) / 0x240;
                                    local_988 = (void *)CONCAT44(local_988._4_4_,iVar42);
                                    iVar36 = (iVar36 + iVar59 * 4) / 0x240;
                                    local_978 = (Allocator *)CONCAT44(local_978._4_4_,iVar36);
                                    *piVar40 = iVar42;
                                    piVar40[lVar27] = (iVar51 + iVar46 + iVar53) / 0x240;
                                    if (iVar62 * 4 + 1 < local_930.w) {
                                      piVar40[1] = (iVar47 + iVar64 * 2) / 0x240;
                                      piVar40[lVar27 + 1] = (iVar38 + iVar61 * 2) / 0x240;
                                    }
                                    if (iVar62 * 4 + 2 < local_930.w) {
                                      piVar40[2] = iVar36;
                                      piVar40[lVar27 + 2] = (iVar46 + iVar51 * 4) / 0x240;
                                    }
                                    if (iVar45 < local_930.w) {
                                      piVar40[3] = (iVar47 + iVar64 * 8 + iVar25) / 0x240;
                                      piVar40[lVar27 + 3] = (iVar38 + iVar61 * 8 + iVar37) / 0x240;
                                    }
                                    piVar40 = piVar40 + local_930.w;
                                  }
                                  piVar13 = piVar13 + 0xc;
                                }
                                local_7f8 = local_7f8 + 2;
                                uVar44 = local_980;
                                uVar68 = local_8c8;
                                local_950 = uVar24;
                                uVar56 = uVar24 + 1;
                              }
                              local_968 = (ulong)(uint)((int)local_968 + local_778);
                              local_938 = uVar65;
                              uVar56 = uVar65 + 2;
                            }
                            local_958 = (long)iVar29;
                            local_948 = (Allocator *)(long)(iVar29 * 3);
                            local_8e0 = (long)(iVar29 * 5);
                            while (uVar56 = uVar65, (long)uVar56 < local_870) {
                              local_978 = (Allocator *)local_930.elemsize;
                              local_988 = (void *)((local_798 + uVar56) * local_930.cstep *
                                                   local_930.elemsize + (long)local_930.data);
                              piVar40 = (int *)((long)(int)local_968 * 4 + (long)local_850.data);
                              for (uVar65 = 0; uVar65 != local_960; uVar65 = uVar65 + 1) {
                                piVar13 = piVar40;
                                for (lVar16 = -5; OVar8 = _local_680, lVar16 != 0;
                                    lVar16 = lVar16 + 1) {
                                  iVar45 = piVar13[lVar14] + piVar13[local_958];
                                  iVar29 = piVar13[local_958] - piVar13[lVar14];
                                  iVar36 = piVar13[local_860] + piVar13[(long)local_948];
                                  iVar46 = piVar13[(long)local_948] - piVar13[local_860];
                                  iVar62 = piVar13[local_8e0];
                                  aiStack_66c[lVar16] = iVar36 + iVar45 + *piVar13;
                                  aiStack_658[lVar16 + 1] = iVar29 + iVar46 * 2;
                                  aiStack_638[lVar16 + -1] = iVar45 + iVar36 * 4;
                                  aiStack_620[lVar16 + -1] = iVar29 + iVar46 * 8 + iVar62 * 4;
                                  piVar13 = piVar13 + lVar15;
                                }
                                iVar29 = piVar13[(long)local_948] - piVar13[local_860];
                                iVar59 = piVar13[local_958] - piVar13[lVar14];
                                iVar36 = piVar13[(long)local_948] + piVar13[local_860];
                                iVar46 = piVar13[lVar14] + piVar13[local_958];
                                iVar62 = iVar50 + (int)uVar65;
                                iVar45 = iVar62 % iVar10;
                                aiStack_66c[0] = (iVar46 + iVar36 + *piVar13) * 4;
                                OVar9 = _local_680;
                                _iStack_650 = OVar8._48_16_;
                                _local_680 = OVar9._0_44_;
                                aiStack_658[1] = iVar29 * 8 + iVar59 * 4;
                                local_640 = CONCAT44(iVar36 * 0x10 + iVar46 * 4,
                                                     (undefined4)local_640);
                                auStack_630._12_4_ =
                                     piVar13[local_8e0] * 0x10 + iVar29 * 0x20 + iVar59 * 4;
                                uVar11 = iVar62 / iVar10 << 2;
                                piVar13 = (int *)((long)local_988 +
                                                 (long)(iVar45 * 4) * 4 +
                                                 (long)local_930.w * local_930.elemsize *
                                                 (long)(int)uVar11);
                                piVar28 = aiStack_66c;
                                for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
                                  if ((int)(uVar11 | (uint)lVar16) < local_930.h) {
                                    iVar36 = piVar28[-3] + piVar28[-4];
                                    iVar62 = piVar28[-1] + piVar28[-2];
                                    iVar46 = piVar28[-4] - piVar28[-3];
                                    iVar59 = piVar28[-2] - piVar28[-1];
                                    iVar29 = *piVar28;
                                    *piVar13 = (iVar62 + iVar36 + piVar28[-5]) / 0x240;
                                    if (iVar45 * 4 + 1 < local_930.w) {
                                      piVar13[1] = (iVar46 + iVar59 * 2) / 0x240;
                                    }
                                    if (iVar45 * 4 + 2 < local_930.w) {
                                      piVar13[2] = (iVar36 + iVar62 * 4) / 0x240;
                                    }
                                    if (iVar45 * 4 + 3 < local_930.w) {
                                      piVar13[3] = (iVar46 + iVar59 * 8 + iVar29) / 0x240;
                                    }
                                    piVar13 = piVar13 + local_930.w;
                                  }
                                  piVar28 = piVar28 + 6;
                                }
                                piVar40 = piVar40 + 1;
                                uVar44 = local_980;
                                uVar68 = local_8c8;
                              }
                              local_968 = (ulong)(uint)((int)local_968 + local_774);
                              local_938 = uVar56;
                              uVar65 = uVar56 + 1;
                            }
                          }
                          if (local_850.refcount != (int *)0x0) {
                            LOCK();
                            *local_850.refcount = *local_850.refcount + -1;
                            UNLOCK();
                            if (*local_850.refcount == 0) {
                              if (local_850.allocator == (Allocator *)0x0) {
                                free(local_850.data);
                              }
                              else {
                                (*(local_850.allocator)->_vptr_Allocator[3])();
                              }
                            }
                          }
                          local_7a4 = iVar36 + 1;
                        }
                      }
                      piVar40 = (int *)CONCAT44(local_8c0.refcount._4_4_,local_8c0.refcount._0_4_);
                      uVar49 = local_720;
                      pCVar60 = local_940;
                      if (piVar40 != (int *)0x0) {
                        LOCK();
                        *piVar40 = *piVar40 + -1;
                        UNLOCK();
                        if (*piVar40 == 0) {
                          if (local_8c0.allocator == (Allocator *)0x0) {
                            free(local_8c0.data);
                            uVar49 = local_720;
                            pCVar60 = local_940;
                          }
                          else {
                            (*(local_8c0.allocator)->_vptr_Allocator[3])();
                            uVar49 = local_720;
                            pCVar60 = local_940;
                          }
                        }
                      }
                    }
                  }
                }
                iVar50 = (int)uVar49;
                piVar40 = (int *)CONCAT44(local_7f0.refcount._4_4_,local_7f0.refcount._0_4_);
                if (piVar40 != (int *)0x0) {
                  LOCK();
                  *piVar40 = *piVar40 + -1;
                  UNLOCK();
                  if (*piVar40 == 0) {
                    if (local_7f0.allocator == (Allocator *)0x0) {
LAB_0018a545:
                      free(local_7f0.data);
                    }
                    else {
                      (*(local_7f0.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
              }
              else {
                iVar50 = conv3x3s1_winograd43_int8_avxvnni
                                   (&local_770,&local_930,&pCVar60->weight_winograd43_data,iVar10,
                                    local_970);
              }
            }
            else {
              iVar50 = conv3x3s1_winograd43_int8_avx512vnni
                                 (&local_770,&local_930,&pCVar60->weight_winograd43_data,iVar10,
                                  local_970);
            }
          }
          else {
            iVar50 = cpu_support_x86_avx512_vnni();
            if (iVar50 == 0) {
              iVar50 = cpu_support_x86_avx_vnni();
              if (iVar50 == 0) {
                auVar87._4_4_ = local_930.h;
                auVar87._0_4_ = local_930.w;
                auVar69 = vpcmpeqd_avx(auVar69,auVar69);
                auVar87._8_8_ = 0;
                auVar69 = vpsubd_avx(auVar87,auVar69);
                auVar85 = vpsrld_avx(auVar69,0x1f);
                auVar69 = vpaddd_avx(auVar69,auVar85);
                auVar85 = vpsrad_avx(auVar69,1);
                auVar69 = vpshufd_avx(auVar85,0x55);
                auVar69 = vpmulld_avx(auVar69,auVar85);
                uVar63 = local_930.elempack * local_930.c;
                uVar44 = (ulong)uVar63;
                iVar50 = auVar69._0_4_;
                lVar14 = CONCAT44(uVar41,iVar50);
                uVar67 = local_770.elempack * local_770.c;
                uVar68 = (ulong)uVar67;
                get_optimal_tile_mnk_int8
                          (uVar63,iVar50,uVar67,&local_98c,(int *)&local_990,&local_8d4,iVar10);
                iVar45 = local_8d4;
                uVar11 = local_990;
                local_878 = CONCAT44(local_878._4_4_,(int)(uVar63 + local_98c + -1) / local_98c);
                iVar36 = (int)(local_990 + iVar50 + -1) / (int)local_990;
                iVar29 = (int)(uVar67 + local_8d4 + -1) / local_8d4;
                local_7f0.cstep = 0;
                iVar62 = local_8d4 * local_990;
                local_7f0.data = (void *)0x0;
                local_7f0.refcount._0_4_ = 0;
                local_7f0.refcount._4_4_ = 0;
                local_7f0.elemsize = 0;
                local_7f0.elempack = 0;
                local_7f0.allocator = (Allocator *)0x0;
                local_7f0.dims = 0;
                local_7f0.w = 0;
                local_7f0.h = 0;
                local_7f0.d = 0;
                local_7f0.c = 0;
                Mat::create(&local_7f0,iVar62,0x10,iVar29,iVar36,2,local_970->workspace_allocator);
                iVar50 = -100;
                local_968 = uVar68;
                local_868 = lVar14;
                local_798 = uVar44;
                if ((local_7f0.data != (void *)0x0) && ((long)local_7f0.c * local_7f0.cstep != 0)) {
                  iVar36 = iVar36 * iVar29;
                  iVar62 = iVar62 * 0x10;
                  uVar41 = uStack_644;
                  if ((iVar10 < 2) || (iVar10 <= iVar36)) {
                    local_640 = 0;
                    _local_680 = ZEXT1228((undefined1  [12])0x0);
                    _local_680 = ZEXT3260(_local_680);
                    _local_680 = (Option)CONCAT460(uVar41,_local_680);
                    Mat::create((Mat *)local_680,iVar62,1,iVar10,2,local_970->workspace_allocator);
                    if (((void *)local_680._0_8_ != (void *)0x0) &&
                       ((long)(int)uStack_64c._4_4_ * local_640 != 0)) {
                      iVar50 = 0;
                      if (iVar36 < 1) {
                        iVar36 = iVar50;
                      }
                      for (; iVar36 != iVar50; iVar50 = iVar50 + 1) {
                        iVar62 = (iVar50 / iVar29) * uVar11;
                        iVar46 = (iVar50 % iVar29) * iVar45;
                        uVar63 = (int)local_868 - iVar62;
                        if ((int)uVar11 < (int)uVar63) {
                          uVar63 = uVar11;
                        }
                        iVar59 = (int)local_968 - iVar46;
                        if (iVar45 < iVar59) {
                          iVar59 = iVar45;
                        }
                        iVar51 = get_omp_thread_num();
                        local_8c0.data =
                             (void *)((long)iVar51 * local_640 * (long)stack0xfffffffffffff990 +
                                     local_680._0_8_);
                        local_8c0.refcount._0_4_ = 0;
                        local_8c0.refcount._4_4_ = 0;
                        local_8c0.elemsize = (size_t)stack0xfffffffffffff990;
                        local_8c0.elempack = aiStack_66c[1];
                        local_8c0.allocator = pAStack_660;
                        local_8c0.w = aiStack_658[1];
                        local_8c0.h = iStack_650;
                        local_8c0.d = 1;
                        local_8c0.c = (int)uStack_64c;
                        local_8c0.dims = aiStack_658[0] + -1;
                        local_8c0.cstep =
                             ((long)stack0xfffffffffffff990 *
                              (long)iStack_650 * (long)aiStack_658[1] + 0xfU & 0xfffffffffffffff0) /
                             (ulong)stack0xfffffffffffff990;
                        if (aiStack_658[0] == 4) {
                          local_8c0.cstep = (long)iStack_650 * (long)aiStack_658[1];
                        }
                        conv3x3s1_winograd23_transform_input_tile_int8
                                  (&local_770,&local_8c0,iVar62,uVar63,iVar46,iVar59,
                                   in_stack_fffffffffffff600);
                        local_850.cstep = (long)local_7f0.h * (long)local_7f0.w;
                        local_850.data =
                             (void *)((long)local_7f0.data +
                                     (uint)(iVar50 % iVar29) * local_7f0.elemsize * local_850.cstep
                                     + (long)(iVar50 / iVar29) * local_7f0.cstep *
                                       local_7f0.elemsize);
                        local_850.refcount = (int *)0x0;
                        local_850.elemsize = local_7f0.elemsize;
                        local_850.elempack = local_7f0.elempack;
                        local_850.allocator = local_7f0.allocator;
                        local_850.dims = 2;
                        local_850.w = local_7f0.w;
                        local_850.h = local_7f0.h;
                        local_850.d = 1;
                        local_850.c = 1;
                        transpose_pack_B_tile_int8
                                  (&local_8c0,&local_850,0x10,uVar63,iVar59,(int)local_850.cstep);
                        pCVar60 = local_940;
                      }
                      if ((Allocator *)local_680._8_8_ != (Allocator *)0x0) {
                        LOCK();
                        *(int *)(_func_int ***)local_680._8_8_ =
                             *(int *)(_func_int ***)local_680._8_8_ + -1;
                        UNLOCK();
                        if (*(int *)(_func_int ***)local_680._8_8_ == 0) {
                          if (pAStack_660 == (Allocator *)0x0) {
                            free((void *)local_680._0_8_);
                            pCVar60 = local_940;
                          }
                          else {
                            (*pAStack_660->_vptr_Allocator[3])();
                            pCVar60 = local_940;
                          }
                        }
                      }
                      goto LAB_0018a58a;
                    }
                    if ((Allocator *)local_680._8_8_ != (Allocator *)0x0) {
                      LOCK();
                      *(int *)(_func_int ***)local_680._8_8_ =
                           *(int *)(_func_int ***)local_680._8_8_ + -1;
                      UNLOCK();
                      if (*(int *)(_func_int ***)local_680._8_8_ == 0) {
                        if (pAStack_660 == (Allocator *)0x0) goto LAB_0018a4f7;
                        (*pAStack_660->_vptr_Allocator[3])();
                      }
                    }
                  }
                  else {
                    local_640 = 0;
                    _local_680 = ZEXT1228((undefined1  [12])0x0);
                    _local_680 = ZEXT3260(_local_680);
                    _local_680 = (Option)CONCAT460(uVar41,_local_680);
                    Mat::create((Mat *)local_680,iVar62,2,local_970->workspace_allocator);
                    if (((void *)local_680._0_8_ == (void *)0x0) ||
                       ((long)(int)uStack_64c._4_4_ * local_640 == 0)) {
                      if ((Allocator *)local_680._8_8_ != (Allocator *)0x0) {
                        LOCK();
                        *(int *)(_func_int ***)local_680._8_8_ =
                             *(int *)(_func_int ***)local_680._8_8_ + -1;
                        UNLOCK();
                        if (*(int *)(_func_int ***)local_680._8_8_ == 0) {
                          if (pAStack_660 == (Allocator *)0x0) {
LAB_0018a4f7:
                            free((void *)local_680._0_8_);
                          }
                          else {
                            (*pAStack_660->_vptr_Allocator[3])();
                          }
                        }
                      }
                    }
                    else {
                      iVar50 = 0;
                      if (iVar36 < 1) {
                        iVar36 = iVar50;
                      }
                      for (; iVar36 != iVar50; iVar50 = iVar50 + 1) {
                        iVar62 = (iVar50 / iVar29) * uVar11;
                        iVar46 = (int)((long)iVar50 % (long)iVar29) * iVar45;
                        uVar63 = (int)local_868 - iVar62;
                        if ((int)uVar11 < (int)uVar63) {
                          uVar63 = uVar11;
                        }
                        iVar59 = (int)local_968 - iVar46;
                        if (iVar45 < iVar59) {
                          iVar59 = iVar45;
                        }
                        conv3x3s1_winograd23_transform_input_tile_int8
                                  (&local_770,(Mat *)local_680,iVar62,uVar63,iVar46,iVar59,
                                   in_stack_fffffffffffff600);
                        local_8c0.cstep = (long)local_7f0.h * (long)local_7f0.w;
                        local_8c0.data =
                             (void *)((long)local_7f0.data +
                                     ((long)iVar50 % (long)iVar29 & 0xffffffffU) *
                                     local_7f0.elemsize * local_8c0.cstep +
                                     (long)(iVar50 / iVar29) * local_7f0.cstep * local_7f0.elemsize)
                        ;
                        local_8c0.refcount._0_4_ = 0;
                        local_8c0.refcount._4_4_ = 0;
                        local_8c0.elemsize = local_7f0.elemsize;
                        local_8c0.elempack = local_7f0.elempack;
                        local_8c0.allocator = local_7f0.allocator;
                        local_8c0.dims = 2;
                        local_8c0.w = local_7f0.w;
                        local_8c0.h = local_7f0.h;
                        local_8c0.d = 1;
                        local_8c0.c = 1;
                        transpose_pack_B_tile_int8
                                  ((Mat *)local_680,&local_8c0,0x10,uVar63,iVar59,
                                   (int)local_8c0.cstep);
                      }
                      pCVar60 = local_940;
                      if ((Allocator *)local_680._8_8_ != (Allocator *)0x0) {
                        LOCK();
                        *(int *)(_func_int ***)local_680._8_8_ =
                             *(int *)(_func_int ***)local_680._8_8_ + -1;
                        UNLOCK();
                        if (*(int *)(_func_int ***)local_680._8_8_ == 0) {
                          if (pAStack_660 == (Allocator *)0x0) {
                            free((void *)local_680._0_8_);
                            pCVar60 = local_940;
                          }
                          else {
                            (*pAStack_660->_vptr_Allocator[3])();
                            pCVar60 = local_940;
                          }
                        }
                      }
LAB_0018a58a:
                      local_8c0.cstep = 0;
                      local_8c0.data = (void *)0x0;
                      local_8c0.refcount._0_4_ = 0;
                      local_8c0.refcount._4_4_ = 0;
                      local_8c0.elemsize = 0;
                      local_8c0.elempack = 0;
                      local_8c0.allocator = (Allocator *)0x0;
                      local_8c0.dims = 0;
                      local_8c0.w = 0;
                      local_8c0.h = 0;
                      local_8c0.d = 0;
                      local_8c0.c = 0;
                      Mat::create(&local_8c0,local_990 * local_98c * 0x10,1,iVar10,4,
                                  local_970->workspace_allocator);
                      iVar50 = -100;
                      if ((local_8c0.data != (void *)0x0) &&
                         ((long)local_8c0.c * local_8c0.cstep != 0)) {
                        iVar50 = (int)local_878;
                        if ((int)local_878 < 1) {
                          iVar50 = 0;
                        }
                        local_878 = CONCAT44(local_878._4_4_,iVar50);
                        iVar10 = 0;
                        while( true ) {
                          iVar45 = local_98c;
                          iVar50 = 0;
                          if (iVar10 == (int)local_878) break;
                          local_870 = CONCAT44(local_870._4_4_,iVar10);
                          iVar50 = get_omp_thread_num();
                          local_850.data =
                               (void *)((long)iVar50 * local_8c0.cstep * local_8c0.elemsize +
                                       (long)local_8c0.data);
                          local_850.refcount = (int *)0x0;
                          local_850.elemsize = local_8c0.elemsize;
                          local_850.elempack = local_8c0.elempack;
                          local_850.allocator = local_8c0.allocator;
                          local_850.w = local_8c0.w;
                          local_850.h = local_8c0.h;
                          local_850.c = local_8c0.d;
                          local_850.d = 1;
                          local_850.dims = local_8c0.dims + -1;
                          local_850.cstep =
                               (local_8c0.elemsize * (long)local_8c0.h * (long)local_8c0.w + 0xf &
                               0xfffffffffffffff0) / local_8c0.elemsize;
                          if (local_8c0.dims == 4) {
                            local_850.cstep = (long)local_8c0.h * (long)local_8c0.w;
                          }
                          uVar11 = iVar45 * (int)local_870;
                          local_950 = (ulong)uVar11;
                          iVar50 = (int)local_798 - uVar11;
                          if (iVar45 < iVar50) {
                            iVar50 = iVar45;
                          }
                          local_938 = (ulong)(int)uVar11;
                          local_800 = (void *)CONCAT44(local_800._4_4_,iVar50);
                          local_8e8 = (long)iVar50;
                          for (iVar50 = 0; iVar45 = local_8d4, pCVar60 = local_940,
                              iVar10 = local_98c, uVar63 = local_990,
                              uVar11 = (int)local_868 - iVar50,
                              uVar11 != 0 && iVar50 <= (int)local_868; iVar50 = iVar50 + local_990)
                          {
                            if ((int)local_990 < (int)uVar11) {
                              uVar11 = local_990;
                            }
                            local_980 = (ulong)uVar11;
                            iVar62 = (int)local_968;
                            uVar44 = local_968 & 0xffffffff;
                            iVar36 = 0;
                            while( true ) {
                              OVar8 = _local_680;
                              iVar59 = (int)uVar44;
                              iVar46 = (int)local_980;
                              iVar29 = (int)local_950;
                              if (iVar62 <= iVar36) break;
                              iVar51 = iVar59;
                              if (iVar45 < iVar59) {
                                iVar51 = iVar45;
                              }
                              iVar53 = (local_940->weight_winograd23_data).w;
                              iVar25 = (local_940->weight_winograd23_data).h;
                              unique0x00012000 =
                                   (Allocator *)(local_940->weight_winograd23_data).elemsize;
                              local_640 = (long)iVar25 * (long)iVar53;
                              local_680._8_8_ = 0;
                              local_680._0_8_ =
                                   (long)(local_940->weight_winograd23_data).data +
                                   (long)unique0x00012000 * local_640 * (long)(iVar36 / iVar45) +
                                   (long)(int)((long)((ulong)(uint)(iVar29 >> 0x1f) << 0x20 |
                                                     local_950 & 0xffffffff) / (long)iVar10) *
                                   (local_940->weight_winograd23_data).cstep *
                                   (long)unique0x00012000;
                              stack0xfffffffffffff99c = OVar8._28_36_;
                              aiStack_66c[1] = (local_940->weight_winograd23_data).elempack;
                              pAStack_660 = (local_940->weight_winograd23_data).allocator;
                              local_718.dims = 2;
                              aiStack_658[0] = 2;
                              aiStack_658[1]._0_1_ = (bool)(char)iVar53;
                              aiStack_658[1]._1_1_ = (bool)(char)((uint)iVar53 >> 8);
                              aiStack_658[1]._2_1_ = (bool)(char)((uint)iVar53 >> 0x10);
                              aiStack_658[1]._3_1_ = (bool)(char)((uint)iVar53 >> 0x18);
                              iStack_650 = iVar25;
                              uStack_644 = OVar8._60_4_;
                              uStack_64c._0_1_ = true;
                              uStack_64c._1_1_ = false;
                              uStack_64c._2_1_ = false;
                              uStack_64c._3_1_ = false;
                              uStack_64c._4_1_ = true;
                              uStack_64c._5_1_ = false;
                              uStack_64c._6_1_ = false;
                              uStack_64c._7_1_ = false;
                              local_718.cstep = (long)local_7f0.h * (long)local_7f0.w;
                              local_718.data =
                                   (void *)((long)local_7f0.data +
                                           local_718.cstep * local_7f0.elemsize *
                                           (long)(iVar36 / iVar45) +
                                           (long)(iVar50 / (int)uVar63) * local_7f0.cstep *
                                           local_7f0.elemsize);
                              local_718.refcount = (int *)0x0;
                              local_718.elemsize = local_7f0.elemsize;
                              local_718.elempack = local_7f0.elempack;
                              local_718.allocator = local_7f0.allocator;
                              local_718.w = local_7f0.w;
                              local_718.h = local_7f0.h;
                              local_718.d = 1;
                              local_718.c = 1;
                              gemm_transB_packed_tile_int8
                                        ((Mat *)local_680,&local_718,&local_850,0x10,(int)local_800,
                                         iVar46,iVar36,iVar51,iVar62 <= iVar36 + iVar45);
                              uVar44 = (ulong)(uint)-(iVar45 - iVar59);
                              iVar36 = iVar36 + iVar45;
                            }
                            iVar62 = (int)local_930.cstep * local_930.elempack;
                            iVar45 = (local_930.w + 1) / 2;
                            iVar36 = iVar46 * 0x10;
                            iVar59 = iVar46 * 0x20;
                            auVar75 = vpbroadcastd_avx512f();
                            auVar75 = vpmulld_avx512f(auVar75,_DAT_005399c0);
                            local_790 = (Allocator *)CONCAT44(local_790._4_4_,iVar62);
                            lVar14 = (long)iVar62;
                            iVar10 = 0;
                            pvVar26 = (void *)0x0;
                            if (0 < iVar46) {
                              pvVar26 = (void *)(local_980 & 0xffffffff);
                            }
                            lVar15 = (long)(local_930.elempack * local_930.w);
                            local_7f8 = (int *)CONCAT44(local_7f8._4_4_,iVar46 * 0x100);
                            local_860 = CONCAT44(local_860._4_4_,iVar59);
                            local_948 = (Allocator *)((long)iVar59 * 4);
                            local_8c8 = CONCAT44(local_8c8._4_4_,iVar36);
                            local_978 = (Allocator *)((long)iVar36 * 4);
                            uVar44 = 0;
                            while (uVar68 = uVar44, (long)(uVar68 | 0xf) < local_8e8) {
                              lVar16 = (long)iVar10;
                              lVar27 = 0;
                              for (pvVar30 = (void *)0x0; pvVar30 != pvVar26;
                                  pvVar30 = (void *)((long)pvVar30 + 1)) {
                                lVar43 = (long)local_850.data + lVar27;
                                for (lVar54 = -0x100; lVar54 != 0; lVar54 = lVar54 + 0x40) {
                                  auVar76 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                               ((long)&local_978->_vptr_Allocator +
                                                               lVar43 + lVar16 * 4));
                                  auVar77 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                                               ((long)&local_948->_vptr_Allocator +
                                                               lVar43 + lVar16 * 4));
                                  auVar78 = vpaddd_avx512f(auVar76,*(undefined1 (*) [64])
                                                                    (lVar43 + lVar16 * 4));
                                  auVar78 = vpaddd_avx512f(auVar78,auVar77);
                                  auVar76 = vpsubd_avx512f(auVar76,auVar77);
                                  auVar77 = vpaddd_avx512f(auVar76,*(undefined1 (*) [64])
                                                                    (lVar43 + (long)(iVar46 * 0x30)
                                                                              * 4 + lVar16 * 4));
                                  auVar76 = vmovdqa64_avx512f(auVar78);
                                  *(undefined1 (*) [64])(local_580 + lVar54) = auVar76;
                                  auVar76 = vmovdqa64_avx512f(auVar77);
                                  *(undefined1 (*) [64])(auStack_480 + lVar54) = auVar76;
                                  lVar43 = lVar43 + (long)(iVar46 * 0x40) * 4;
                                }
                                iVar53 = iVar50 + (int)pvVar30;
                                iVar51 = iVar53 % iVar45;
                                uVar11 = (iVar53 / iVar45) * 2;
                                pauVar19 = (undefined1 (*) [64])
                                           ((long)local_930.data +
                                           (long)(iVar51 * 2 * local_930.elempack) * 4 +
                                           (long)local_930.w * local_930.elemsize *
                                           (long)(int)uVar11 +
                                           (long)((iVar29 + (int)uVar68) / local_930.elempack) *
                                           local_930.cstep * local_930.elemsize);
                                iVar51 = iVar51 * 2 + 1;
                                pauVar33 = &local_5c0;
                                for (lVar43 = 0; lVar43 != 2; lVar43 = lVar43 + 1) {
                                  if ((int)(uVar11 | (uint)lVar43) < local_930.h) {
                                    auVar76 = vmovdqa64_avx512f(pauVar33[-2]);
                                    auVar77 = vpaddd_avx512f(auVar76,pauVar33[-3]);
                                    auVar78 = vmovdqa64_avx512f(pauVar33[-1]);
                                    auVar76 = vpsubd_avx512f(auVar76,auVar78);
                                    auVar76 = vpaddd_avx512f(auVar76,*pauVar33);
                                    auVar77 = vpaddd_avx512f(auVar77,auVar78);
                                    auVar77 = vpsrad_avx512f(auVar77,2);
                                    auVar76 = vpsrad_avx512f(auVar76,2);
                                    if (local_930.elempack == 1) {
                                      vpscatterdd_avx512f(ZEXT864(pauVar19) +
                                                          auVar75 * (undefined1  [64])0x4,0xffff,
                                                          auVar77);
                                      if (iVar51 < local_930.w) {
                                        vpscatterdd_avx512f(ZEXT864(pauVar19) + ZEXT864(4) +
                                                            auVar75 * (undefined1  [64])0x4,0xffff,
                                                            auVar76);
                                      }
                                    }
                                    else if (local_930.elempack == 4) {
                                      *(undefined1 (*) [16])*pauVar19 = auVar77._0_16_;
                                      auVar69 = vextracti32x4_avx512f(auVar77,1);
                                      *(undefined1 (*) [16])(*pauVar19 + lVar14 * 4) = auVar69;
                                      auVar69 = vextracti32x4_avx512f(auVar77,2);
                                      *(undefined1 (*) [16])(*pauVar19 + (long)(iVar62 * 2) * 4) =
                                           auVar69;
                                      auVar69 = vextracti32x4_avx512f(auVar77,3);
                                      *(undefined1 (*) [16])(*pauVar19 + (long)(iVar62 * 3) * 4) =
                                           auVar69;
                                      if (iVar51 < local_930.w) {
                                        *(undefined1 (*) [16])(*pauVar19 + 0x10) = auVar76._0_16_;
                                        auVar69 = vextracti32x4_avx512f(auVar76,1);
                                        *(undefined1 (*) [16])(*pauVar19 + lVar14 * 4 + 8) = auVar69
                                        ;
                                        auVar69 = vextracti32x4_avx512f(auVar76,2);
                                        *(undefined1 (*) [16])
                                         (*pauVar19 + (long)(iVar62 * 2) * 4 + 8) = auVar69;
                                        auVar69 = vextracti32x4_avx512f(auVar76,3);
                                        *(undefined1 (*) [16])
                                         (*pauVar19 + (long)(iVar62 * 3) * 4 + 8) = auVar69;
                                      }
                                    }
                                    else if (local_930.elempack == 8) {
                                      *(undefined1 (*) [32])*pauVar19 = auVar77._0_32_;
                                      auVar72 = vextracti64x4_avx512f(auVar77,1);
                                      *(undefined1 (*) [32])(*pauVar19 + lVar14 * 4) = auVar72;
                                      if (iVar51 < local_930.w) {
                                        *(undefined1 (*) [32])(*pauVar19 + 0x20) = auVar76._0_32_;
                                        auVar72 = vextracti64x4_avx512f(auVar76,1);
                                        *(undefined1 (*) [32])(*pauVar19 + lVar14 * 4 + 0x10) =
                                             auVar72;
                                      }
                                    }
                                    else if (local_930.elempack == 0x10) {
                                      auVar77 = vmovdqa64_avx512f(auVar77);
                                      *pauVar19 = auVar77;
                                      if (iVar51 < local_930.w) {
                                        auVar76 = vmovdqa64_avx512f(auVar76);
                                        pauVar19[1] = auVar76;
                                      }
                                    }
                                    pauVar19 = (undefined1 (*) [64])(*pauVar19 + lVar15 * 4);
                                  }
                                  pauVar33 = pauVar33 + 4;
                                }
                                lVar27 = lVar27 + 0x40;
                              }
                              iVar10 = iVar10 + iVar46 * 0x100;
                              local_960 = uVar68;
                              uVar44 = uVar68 + 0x10;
                            }
                            auVar72 = vpbroadcastd_avx512vl();
                            auVar72 = vpmulld_avx2(auVar72,_DAT_0053a780);
                            local_958 = (long)(iVar46 * 8) * 4;
                            while (uVar44 = uVar68, (long)(uVar44 | 7) < local_8e8) {
                              lVar16 = (long)iVar10;
                              lVar27 = 0;
                              for (pvVar30 = (void *)0x0; pvVar30 != pvVar26;
                                  pvVar30 = (void *)((long)pvVar30 + 1)) {
                                lVar54 = (long)local_850.data + lVar27;
                                for (lVar43 = -0x80; lVar43 != 0; lVar43 = lVar43 + 0x20) {
                                  auVar89 = *(undefined1 (*) [32])(lVar54 + local_958 + lVar16 * 4);
                                  auVar90 = *(undefined1 (*) [32])
                                             ((long)&local_978->_vptr_Allocator +
                                             lVar54 + lVar16 * 4);
                                  auVar105 = vpaddd_avx2(auVar89,*(undefined1 (*) [32])
                                                                  (lVar54 + lVar16 * 4));
                                  auVar105 = vpaddd_avx2(auVar105,auVar90);
                                  auVar89 = vpsubd_avx2(auVar89,auVar90);
                                  auVar89 = vpaddd_avx2(auVar89,*(undefined1 (*) [32])
                                                                 (lVar54 + (long)(iVar46 * 0x18) * 4
                                                                           + lVar16 * 4));
                                  *(undefined1 (*) [32])(local_600 + lVar43) = auVar105;
                                  *(undefined1 (*) [32])(local_580 + lVar43) = auVar89;
                                  lVar54 = (long)&local_948->_vptr_Allocator + lVar54;
                                }
                                iVar51 = iVar50 + (int)pvVar30;
                                iVar62 = iVar51 % iVar45;
                                uVar11 = (iVar51 / iVar45) * 2;
                                pauVar22 = (undefined1 (*) [32])
                                           ((long)local_930.data +
                                           (long)(iVar62 * 2 * local_930.elempack) * 4 +
                                           (long)local_930.w * local_930.elemsize *
                                           (long)(int)uVar11 +
                                           (long)((iVar29 + (int)uVar44) / local_930.elempack) *
                                           local_930.cstep * local_930.elemsize);
                                iVar62 = iVar62 * 2 + 1;
                                pauVar31 = (undefined1 (*) [32])aiStack_620;
                                for (lVar43 = 0; lVar43 != 2; lVar43 = lVar43 + 1) {
                                  if ((int)(uVar11 | (uint)lVar43) < local_930.h) {
                                    auVar89 = vpaddd_avx2(pauVar31[-2],pauVar31[-3]);
                                    auVar90 = vpsubd_avx2(pauVar31[-2],pauVar31[-1]);
                                    auVar90 = vpaddd_avx2(auVar90,*pauVar31);
                                    auVar89 = vpaddd_avx2(auVar89,pauVar31[-1]);
                                    auVar105 = vpsrad_avx2(auVar89,2);
                                    auVar89 = vpsrad_avx2(auVar90,2);
                                    if (local_930.elempack == 1) {
                                      vpscatterdd_avx512vl
                                                (ZEXT832(pauVar22) + auVar72 * (undefined1  [32])0x4
                                                 ,0xffff,auVar105);
                                      if (iVar62 < local_930.w) {
                                        vpscatterdd_avx512vl
                                                  (ZEXT832(pauVar22) + ZEXT832(4) +
                                                   auVar72 * (undefined1  [32])0x4,0xffff,auVar89);
                                      }
                                    }
                                    else if (local_930.elempack == 4) {
                                      *(undefined1 (*) [16])*pauVar22 = auVar105._0_16_;
                                      *(undefined1 (*) [16])(*pauVar22 + lVar14 * 4) =
                                           auVar105._16_16_;
                                      if (iVar62 < local_930.w) {
                                        *(undefined1 (*) [16])(*pauVar22 + 0x10) = auVar89._0_16_;
                                        *(undefined1 (*) [16])(*pauVar22 + lVar14 * 4 + 0x10) =
                                             auVar89._16_16_;
                                      }
                                    }
                                    else if ((local_930.elempack == 8) &&
                                            (*pauVar22 = auVar105, iVar62 < local_930.w)) {
                                      pauVar22[1] = auVar89;
                                    }
                                    pauVar22 = (undefined1 (*) [32])(*pauVar22 + lVar15 * 4);
                                  }
                                  pauVar31 = pauVar31 + 4;
                                }
                                lVar27 = lVar27 + 0x20;
                              }
                              iVar10 = iVar10 + iVar46 * 0x80;
                              local_960 = uVar44;
                              uVar68 = uVar44 + 8;
                            }
                            local_8e0 = (long)(iVar46 * 4);
                            auVar69 = vpbroadcastd_avx512vl();
                            auVar69 = vpmulld_avx(auVar69,_DAT_00539450);
                            local_988 = (void *)((long)(iVar46 * 0xc) * 4);
                            while (uVar68 = uVar44, (long)(uVar68 | 3) < local_8e8) {
                              lVar16 = (long)iVar10;
                              lVar27 = 0;
                              for (pvVar30 = (void *)0x0; pvVar30 != pvVar26;
                                  pvVar30 = (void *)((long)pvVar30 + 1)) {
                                lVar54 = (long)local_850.data + lVar27;
                                for (lVar43 = -0x40; lVar43 != 0; lVar43 = lVar43 + 0x10) {
                                  auVar85 = *(undefined1 (*) [16])
                                             (lVar54 + local_8e0 * 4 + lVar16 * 4);
                                  auVar87 = *(undefined1 (*) [16])(lVar54 + local_958 + lVar16 * 4);
                                  auVar104 = vpaddd_avx(auVar85,*(undefined1 (*) [16])
                                                                 (lVar54 + lVar16 * 4));
                                  auVar104 = vpaddd_avx(auVar104,auVar87);
                                  auVar85 = vpsubd_avx(auVar85,auVar87);
                                  auVar85 = vpaddd_avx(auVar85,*(undefined1 (*) [16])
                                                                ((long)local_988 +
                                                                lVar54 + lVar16 * 4));
                                  *(undefined1 (*) [16])((long)aiStack_638 + lVar43 + -8) = auVar104
                                  ;
                                  *(undefined1 (*) [16])(local_600 + lVar43) = auVar85;
                                  lVar54 = (long)&local_978->_vptr_Allocator + lVar54;
                                }
                                iVar51 = iVar50 + (int)pvVar30;
                                iVar62 = iVar51 % iVar45;
                                uVar11 = (iVar51 / iVar45) * 2;
                                pauVar23 = (undefined1 (*) [16])
                                           ((long)local_930.data +
                                           (long)(iVar62 * 2 * local_930.elempack) * 4 +
                                           (long)local_930.w * local_930.elemsize *
                                           (long)(int)uVar11 +
                                           (long)((iVar29 + (int)uVar68) / local_930.elempack) *
                                           local_930.cstep * local_930.elemsize);
                                iVar62 = iVar62 * 2 + 1;
                                pauVar48 = (undefined1 (*) [16])&iStack_650;
                                for (lVar43 = 0; lVar43 != 2; lVar43 = lVar43 + 1) {
                                  if ((int)(uVar11 | (uint)lVar43) < local_930.h) {
                                    auVar85 = vpaddd_avx(pauVar48[-2],pauVar48[-3]);
                                    auVar87 = vpsubd_avx(pauVar48[-2],pauVar48[-1]);
                                    auVar87 = vpaddd_avx(auVar87,*pauVar48);
                                    auVar85 = vpaddd_avx(auVar85,pauVar48[-1]);
                                    auVar104 = vpsrad_avx(auVar85,2);
                                    auVar85 = vpsrad_avx(auVar87,2);
                                    if (local_930.elempack == 1) {
                                      auVar70._8_8_ = 0;
                                      auVar70._0_8_ = pauVar23;
                                      vpscatterdd_avx512vl
                                                (auVar70 + auVar69 * (undefined1  [16])0x4,0xffff,
                                                 auVar104);
                                      if (iVar62 < local_930.w) {
                                        auVar104._8_8_ = 0;
                                        auVar104._0_8_ = pauVar23;
                                        vpscatterdd_avx512vl
                                                  (auVar104 + ZEXT816(4) +
                                                   auVar69 * (undefined1  [16])0x4,0xffff,auVar85);
                                      }
                                    }
                                    else if ((local_930.elempack == 4) &&
                                            (*pauVar23 = auVar104, iVar62 < local_930.w)) {
                                      pauVar23[1] = auVar85;
                                    }
                                    pauVar23 = (undefined1 (*) [16])(*pauVar23 + lVar15 * 4);
                                  }
                                  pauVar48 = pauVar48 + 4;
                                }
                                lVar27 = lVar27 + 0x10;
                              }
                              iVar10 = iVar10 + iVar46 * 0x40;
                              local_960 = uVar68;
                              uVar44 = uVar68 + 4;
                            }
                            local_8d0 = (long)(iVar46 * 6);
                            while (uVar44 = uVar68, (long)(uVar44 | 1) < local_8e8) {
                              local_948 = (Allocator *)local_930.elemsize;
                              local_978 = (Allocator *)
                                          ((local_938 + uVar44) * local_930.cstep *
                                           local_930.elemsize + (long)local_930.data);
                              puVar52 = (ulong *)((long)iVar10 * 4 + (long)local_850.data);
                              pvVar30 = (void *)0x0;
                              while (pvVar55 = pvVar30, pvVar55 != pvVar26) {
                                puVar12 = puVar52;
                                for (lVar15 = -4; lVar15 != 0; lVar15 = lVar15 + 1) {
                                  auVar69._8_8_ = 0;
                                  auVar69._0_8_ = *puVar12;
                                  auVar93._8_8_ = 0;
                                  auVar93._0_8_ = *(ulong *)((long)puVar12 + (long)(iVar46 * 2) * 4)
                                  ;
                                  auVar69 = vpaddd_avx(auVar93,auVar69);
                                  auVar91._8_8_ = 0;
                                  auVar91._0_8_ = *(ulong *)((long)puVar12 + local_8e0 * 4);
                                  auVar69 = vpaddd_avx(auVar69,auVar91);
                                  (&pAStack_660)[lVar15] = auVar69._0_8_;
                                  auVar69 = vpsubd_avx(auVar93,auVar91);
                                  auVar95._8_8_ = 0;
                                  auVar95._0_8_ = *(ulong *)((long)puVar12 + local_8d0 * 4);
                                  auVar69 = vpaddd_avx(auVar69,auVar95);
                                  *(long *)(aiStack_638 + lVar15 * 2 + -2) = auVar69._0_8_;
                                  puVar12 = (ulong *)((long)puVar12 + local_958);
                                }
                                iVar29 = iVar50 + (int)pvVar55;
                                iVar62 = iVar29 % iVar45;
                                uVar11 = (iVar29 / iVar45) * 2;
                                piVar40 = (int *)((long)&local_978->_vptr_Allocator +
                                                 (long)(iVar62 * 2) * 4 +
                                                 (long)local_930.w * local_930.elemsize *
                                                 (long)(int)uVar11);
                                piVar13 = aiStack_66c + 2;
                                for (lVar15 = 0; lVar15 != 2; lVar15 = lVar15 + 1) {
                                  if ((int)(uVar11 | (uint)lVar15) < local_930.h) {
                                    iVar29 = piVar13[-5];
                                    iVar51 = piVar13[-4];
                                    iVar53 = piVar13[-3];
                                    iVar25 = piVar13[-6];
                                    iVar37 = piVar13[-2];
                                    iVar42 = piVar13[-1];
                                    iVar47 = *piVar13;
                                    *piVar40 = piVar13[-7] + iVar29 + iVar53 >> 2;
                                    piVar40[lVar14] = iVar25 + iVar51 + iVar37 >> 2;
                                    if (iVar62 * 2 + 1 < local_930.w) {
                                      piVar40[1] = (iVar29 - iVar53) + iVar42 >> 2;
                                      piVar40[lVar14 + 1] = (iVar51 - iVar37) + iVar47 >> 2;
                                    }
                                    piVar40 = piVar40 + local_930.w;
                                  }
                                  piVar13 = piVar13 + 8;
                                }
                                puVar52 = puVar52 + 1;
                                local_988 = pvVar55;
                                pvVar30 = (void *)((long)pvVar55 + 1);
                              }
                              iVar10 = iVar10 + iVar59;
                              local_960 = uVar44;
                              uVar68 = uVar44 + 2;
                            }
                            while (uVar68 = uVar44, (long)uVar68 < local_8e8) {
                              piVar40 = (int *)((long)iVar10 * 4 + (long)local_850.data);
                              for (pvVar30 = (void *)0x0; pvVar30 != pvVar26;
                                  pvVar30 = (void *)((long)pvVar30 + 1)) {
                                piVar13 = piVar40;
                                for (lVar14 = -4; lVar14 != 0; lVar14 = lVar14 + 1) {
                                  iVar62 = piVar13[iVar46];
                                  iVar29 = piVar13[iVar46 * 2];
                                  aiStack_66c[lVar14 + -1] = *piVar13 + iVar62 + iVar29;
                                  *(int *)((long)&pAStack_660 + lVar14 * 4) =
                                       (iVar62 - iVar29) + piVar13[iVar46 * 3];
                                  piVar13 = piVar13 + local_8e0;
                                }
                                iVar29 = iVar50 + (int)pvVar30;
                                iVar62 = iVar29 % iVar45;
                                uVar11 = (iVar29 / iVar45) * 2;
                                piVar13 = (int *)((long)local_930.data +
                                                 (long)(iVar62 * 2) * 4 +
                                                 (long)local_930.w * local_930.elemsize *
                                                 (long)(int)uVar11 +
                                                 (local_938 + uVar68) * local_930.cstep *
                                                 local_930.elemsize);
                                piVar28 = (int *)(local_680 + 0xc);
                                for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
                                  if ((int)(uVar11 | (uint)lVar14) < local_930.h) {
                                    iVar29 = piVar28[-2];
                                    iVar59 = piVar28[-1];
                                    iVar51 = *piVar28;
                                    *piVar13 = piVar28[-3] + iVar29 + iVar59 >> 2;
                                    if (iVar62 * 2 + 1 < local_930.w) {
                                      piVar13[1] = (iVar29 - iVar59) + iVar51 >> 2;
                                    }
                                    piVar13 = piVar13 + local_930.w;
                                  }
                                  piVar28 = piVar28 + 4;
                                }
                                piVar40 = piVar40 + 1;
                              }
                              iVar10 = iVar10 + iVar36;
                              local_960 = uVar68;
                              uVar44 = uVar68 + 1;
                            }
                          }
                          if (local_850.refcount != (int *)0x0) {
                            LOCK();
                            *local_850.refcount = *local_850.refcount + -1;
                            UNLOCK();
                            if (*local_850.refcount == 0) {
                              if (local_850.allocator == (Allocator *)0x0) {
                                free(local_850.data);
                              }
                              else {
                                (*(local_850.allocator)->_vptr_Allocator[3])();
                              }
                            }
                          }
                          iVar10 = (int)local_870 + 1;
                        }
                      }
                      piVar40 = (int *)CONCAT44(local_8c0.refcount._4_4_,local_8c0.refcount._0_4_);
                      if (piVar40 != (int *)0x0) {
                        LOCK();
                        *piVar40 = *piVar40 + -1;
                        UNLOCK();
                        if (*piVar40 == 0) {
                          if (local_8c0.allocator == (Allocator *)0x0) {
                            free(local_8c0.data);
                          }
                          else {
                            (*(local_8c0.allocator)->_vptr_Allocator[3])();
                          }
                        }
                      }
                    }
                  }
                }
                piVar40 = (int *)CONCAT44(local_7f0.refcount._4_4_,local_7f0.refcount._0_4_);
                if (piVar40 != (int *)0x0) {
                  LOCK();
                  *piVar40 = *piVar40 + -1;
                  UNLOCK();
                  if (*piVar40 == 0) {
                    if (local_7f0.allocator == (Allocator *)0x0) goto LAB_0018a545;
                    (*(local_7f0.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              else {
                iVar50 = conv3x3s1_winograd23_int8_avxvnni
                                   (&local_770,&local_930,&pCVar60->weight_winograd23_data,iVar10,
                                    local_970);
              }
            }
            else {
              iVar50 = conv3x3s1_winograd23_int8_avx512vnni
                                 (&local_770,&local_930,&pCVar60->weight_winograd23_data,iVar10,
                                  local_970);
            }
          }
LAB_001890d7:
          if (iVar50 != 0) goto LAB_00189fb3;
        }
        else {
          if (opt->use_sgemm_convolution == true) {
            iVar50 = convolution_im2col_gemm_int8
                               (&local_770,&local_930,&pCVar60->weight_sgemm_data,iVar50,iVar45,
                                iVar36,iVar62,iVar29,iVar46,iVar10,opt);
            goto LAB_001890d7;
          }
          convolution_packed_int8
                    (&local_770,&local_930,&pCVar60->weight_data_tm,iVar50,iVar45,iVar36,iVar62,
                     iVar29,iVar46,opt);
        }
        opt_00 = local_970;
        if (local_970->use_packing_layout == true) {
          uVar41 = uStack_644;
          if (100 < local_854) {
            if (local_930.elempack == 4) {
              if ((local_930.c & 0x80000001U) == 1) {
                local_640 = 0;
                _local_680 = ZEXT1228((undefined1  [12])0x0);
                _local_680 = ZEXT3260(_local_680);
                _local_680 = (Option)CONCAT460(uVar41,_local_680);
                convert_packing(&local_930,(Mat *)local_680,1,local_970);
                if ((Allocator *)local_680._8_8_ != (Allocator *)0x0) {
                  LOCK();
                  *(int *)(_func_int ***)local_680._8_8_ =
                       *(int *)(_func_int ***)local_680._8_8_ + 1;
                  UNLOCK();
                }
                piVar40 = (int *)CONCAT44(local_930.refcount._4_4_,local_930.refcount._0_4_);
                if (piVar40 != (int *)0x0) {
                  LOCK();
                  *piVar40 = *piVar40 + -1;
                  UNLOCK();
                  if (*piVar40 == 0) {
                    if (local_930.allocator == (Allocator *)0x0) {
                      free(local_930.data);
                    }
                    else {
                      (*(local_930.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                local_930.data = (void *)local_680._0_8_;
                local_930.refcount._0_4_ = local_680._8_4_;
                local_930.refcount._4_4_ = local_680._12_4_;
                local_930.elemsize = (size_t)stack0xfffffffffffff990;
                local_930.elempack = aiStack_66c[1];
                local_930.allocator = pAStack_660;
                local_930.dims = local_680._40_4_;
                local_930.w = local_680._44_4_;
                local_930.h = local_680._48_4_;
                local_930.d = local_680._52_4_;
                local_930.c = uStack_64c._4_4_;
                local_930.cstep = local_640;
                if ((Allocator *)local_680._8_8_ != (Allocator *)0x0) {
                  LOCK();
                  *(int *)(_func_int ***)local_680._8_8_ =
                       *(int *)(_func_int ***)local_680._8_8_ + -1;
                  UNLOCK();
                  if (*(int *)(_func_int ***)local_680._8_8_ == 0) {
                    if (pAStack_660 == (Allocator *)0x0) {
                      free((void *)local_680._0_8_);
                    }
                    else {
                      (*pAStack_660->_vptr_Allocator[3])();
                    }
                  }
                }
                if (local_930.elempack != 4) goto LAB_001891bb;
              }
              OVar8 = _local_680;
              if ((local_930.c & 1U) == 0) {
                local_640 = 0;
                _local_680 = ZEXT1228((undefined1  [12])0x0);
                uStack_644 = OVar8._60_4_;
                _local_680 = ZEXT3260(_local_680);
                convert_packing(&local_930,(Mat *)local_680,8,opt_00);
                if ((Allocator *)local_680._8_8_ != (Allocator *)0x0) {
                  LOCK();
                  *(int *)(_func_int ***)local_680._8_8_ =
                       *(int *)(_func_int ***)local_680._8_8_ + 1;
                  UNLOCK();
                }
                piVar40 = (int *)CONCAT44(local_930.refcount._4_4_,local_930.refcount._0_4_);
                if (piVar40 != (int *)0x0) {
                  LOCK();
                  *piVar40 = *piVar40 + -1;
                  UNLOCK();
                  if (*piVar40 == 0) {
                    if (local_930.allocator == (Allocator *)0x0) {
                      free(local_930.data);
                    }
                    else {
                      (*(local_930.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                local_930.data = (void *)local_680._0_8_;
                local_930.refcount._0_4_ = local_680._8_4_;
                local_930.refcount._4_4_ = local_680._12_4_;
                local_930.elemsize = (size_t)stack0xfffffffffffff990;
                local_930.elempack = aiStack_66c[1];
                local_930.allocator = pAStack_660;
                local_930.dims = local_680._40_4_;
                local_930.w = local_680._44_4_;
                local_930.h = local_680._48_4_;
                local_930.d = local_680._52_4_;
                local_930.c = uStack_64c._4_4_;
                local_930.cstep = local_640;
                if ((Allocator *)local_680._8_8_ != (Allocator *)0x0) {
                  LOCK();
                  *(int *)(_func_int ***)local_680._8_8_ =
                       *(int *)(_func_int ***)local_680._8_8_ + -1;
                  UNLOCK();
                  if (*(int *)(_func_int ***)local_680._8_8_ == 0) {
                    if (pAStack_660 == (Allocator *)0x0) {
                      free((void *)local_680._0_8_);
                    }
                    else {
                      (*pAStack_660->_vptr_Allocator[3])();
                    }
                  }
                }
              }
            }
LAB_001891bb:
            requantize_from_int32_to_int8
                      (&local_930,local_7a0,&pCVar60->scale_in_data,
                       &(pCVar60->super_Convolution).top_blob_int8_scales,
                       &(pCVar60->super_Convolution).bias_data,
                       (pCVar60->super_Convolution).activation_type,
                       &(pCVar60->super_Convolution).activation_params,opt_00);
            iVar50 = 0;
            goto LAB_00189fb3;
          }
          if ((local_930.elempack == 4) && ((local_930.c & 1U) == 0)) {
            local_640 = 0;
            _local_680 = ZEXT1228((undefined1  [12])0x0);
            _local_680 = ZEXT3260(_local_680);
            _local_680 = (Option)CONCAT460(uVar41,_local_680);
            convert_packing(&local_930,(Mat *)local_680,8,local_970);
            if ((Allocator *)local_680._8_8_ != (Allocator *)0x0) {
              LOCK();
              *(int *)(_func_int ***)local_680._8_8_ = *(int *)(_func_int ***)local_680._8_8_ + 1;
              UNLOCK();
            }
            piVar40 = (int *)CONCAT44(local_930.refcount._4_4_,local_930.refcount._0_4_);
            if (piVar40 != (int *)0x0) {
              LOCK();
              *piVar40 = *piVar40 + -1;
              UNLOCK();
              if (*piVar40 == 0) {
                if (local_930.allocator == (Allocator *)0x0) {
                  free(local_930.data);
                }
                else {
                  (*(local_930.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            local_930.data = (void *)local_680._0_8_;
            local_930.refcount._0_4_ = local_680._8_4_;
            local_930.refcount._4_4_ = local_680._12_4_;
            local_930.elemsize = (size_t)stack0xfffffffffffff990;
            local_930.elempack = aiStack_66c[1];
            local_930.allocator = pAStack_660;
            local_930.dims = local_680._40_4_;
            local_930.w = local_680._44_4_;
            local_930.h = local_680._48_4_;
            local_930.d = local_680._52_4_;
            local_930.c = uStack_64c._4_4_;
            local_930.cstep = local_640;
            if ((Allocator *)local_680._8_8_ != (Allocator *)0x0) {
              LOCK();
              *(int *)(_func_int ***)local_680._8_8_ = *(int *)(_func_int ***)local_680._8_8_ + -1;
              UNLOCK();
              if (*(int *)(_func_int ***)local_680._8_8_ == 0) {
                if (pAStack_660 == (Allocator *)0x0) {
                  free((void *)local_680._0_8_);
                }
                else {
                  (*pAStack_660->_vptr_Allocator[3])();
                }
              }
            }
          }
        }
        else if (100 < local_854) goto LAB_001891bb;
        dequantize_from_int32
                  (&local_930,local_7a0,&pCVar60->scale_in_data,
                   &(pCVar60->super_Convolution).bias_data,opt_00);
        pLVar6 = pCVar60->activation;
        iVar50 = 0;
        if (pLVar6 != (Layer *)0x0) {
          (*pLVar6->_vptr_Layer[9])(pLVar6,local_7a0,local_970);
          iVar50 = 0;
        }
      }
LAB_00189fb3:
      piVar40 = (int *)CONCAT44(local_930.refcount._4_4_,local_930.refcount._0_4_);
      if (piVar40 != (int *)0x0) {
        LOCK();
        *piVar40 = *piVar40 + -1;
        UNLOCK();
        if (*piVar40 == 0) {
          if (local_930.allocator == (Allocator *)0x0) {
            free(local_930.data);
          }
          else {
            (*(local_930.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  piVar40 = (int *)CONCAT44(local_770.refcount._4_4_,local_770.refcount._0_4_);
  if (piVar40 != (int *)0x0) {
    LOCK();
    *piVar40 = *piVar40 + -1;
    UNLOCK();
    if (*piVar40 == 0) {
      if (local_770.allocator == (Allocator *)0x0) {
        free(local_770.data);
      }
      else {
        (*(local_770.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0018a03f:
  if (local_6d0.refcount != (int *)0x0) {
    LOCK();
    *local_6d0.refcount = *local_6d0.refcount + -1;
    UNLOCK();
    if (*local_6d0.refcount == 0) {
      if (local_6d0.allocator == (Allocator *)0x0) {
        free(local_6d0.data);
      }
      else {
        (*(local_6d0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar50;
}

Assistant:

int Convolution_x86_avx512::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    //     NCNN_LOGE("Convolution_x86_avx512 input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
        {
#if __AVX512F__
            out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
        }
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_x86 %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
        {
#if __AVX__
            out_elempack_int32 = num_output % 8 == 0 ? 8 : 1;
#else
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
#endif
        }
        else
        {
#if __AVX512F__
            out_elempack_int32 = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
            out_elempack_int32 = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
#endif
        }
    }
#endif // __SSE2__

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && (num_input > 8 || num_output > 8);

#if __SSE2__
    if (opt.use_packing_layout)
    {
        if ((opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1) || (!opt.use_sgemm_convolution))
        {
            // TODO implement winograd and packed int8 avx pack8 output
            out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
        }
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, convolution gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (opt.use_winograd43_convolution && !weight_winograd43_data.empty())
            ret = conv3x3s1_winograd43_int8(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, _nT, opt);
        else
            ret = conv3x3s1_winograd23_int8(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, _nT, opt);
    }
    else if (opt.use_sgemm_convolution)
    {
        ret = convolution_im2col_gemm_int8(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, _nT, opt);
    }
    else
    {
        convolution_packed_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
    }
    if (ret != 0)
        return ret;

#if __SSE2__
    if (opt.use_packing_layout)
    {
        // NCNN_LOGE("top_blob_int32  %d  %d", top_blob_int32.c, top_blob_int32.elempack);
        if (use_int8_requantize)
        {
            // TODO implement winograd and packed int8 pack1 output
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 1)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 1, opt);
                top_blob_int32 = tmp;
            }
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 0)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 8, opt);
                top_blob_int32 = tmp;
            }
        }
        else
        {
#if __AVX__
            // TODO implement winograd and packed int8 avx pack8 output
            if (top_blob_int32.elempack == 4 && top_blob_int32.c % 2 == 0)
            {
                Mat tmp;
                convert_packing(top_blob_int32, tmp, 8, opt);
                top_blob_int32 = tmp;
            }
#endif // __AVX__
        }
    }
#endif

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}